

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx2::CurveNvIntersector1<4>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  int iVar11;
  ulong uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  uint uVar78;
  uint uVar79;
  ulong uVar80;
  ulong uVar81;
  long lVar82;
  uint uVar83;
  ulong uVar84;
  undefined4 uVar85;
  undefined8 unaff_R12;
  ulong uVar86;
  bool bVar87;
  float fVar88;
  undefined8 uVar91;
  undefined1 auVar92 [12];
  vint4 bi_2;
  undefined4 uVar90;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar125;
  float fVar127;
  float fVar129;
  undefined1 auVar111 [32];
  float fVar89;
  float fVar126;
  float fVar128;
  float fVar130;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar98 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar147;
  float fVar167;
  float fVar168;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar169;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar170;
  vint4 ai_2;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  float fVar187;
  float fVar205;
  float fVar206;
  vint4 ai;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar207;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar219;
  float fVar220;
  vint4 bi;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar221;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  vint4 ai_1;
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar234 [28];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  float fVar243;
  float fVar254;
  float fVar255;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar256;
  float fVar258;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar257;
  float fVar259;
  float fVar260;
  undefined1 auVar253 [64];
  undefined1 auVar261 [16];
  float fVar268;
  undefined1 auVar264 [32];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [64];
  undefined1 auVar269 [32];
  undefined1 auVar270 [64];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  undefined1 auVar274 [16];
  float fVar275;
  float fVar276;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar287;
  float fVar288;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_aec;
  undefined1 local_ac0 [32];
  RTCFilterFunctionNArguments local_a98;
  int local_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a10 [16];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined8 local_930;
  float local_928;
  float local_924;
  undefined4 local_920;
  uint local_91c;
  uint local_918;
  uint local_914;
  uint local_910;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [16];
  Primitive *local_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined4 uStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar114 [32];
  
  PVar3 = prim[1];
  uVar80 = (ulong)(byte)PVar3;
  fVar170 = *(float *)(prim + uVar80 * 0x19 + 0x12);
  auVar246 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar80 * 0x19 + 6));
  auVar93._0_4_ = fVar170 * auVar246._0_4_;
  auVar93._4_4_ = fVar170 * auVar246._4_4_;
  auVar93._8_4_ = fVar170 * auVar246._8_4_;
  auVar93._12_4_ = fVar170 * auVar246._12_4_;
  auVar208._0_4_ = fVar170 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar208._4_4_ = fVar170 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar208._8_4_ = fVar170 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar208._12_4_ = fVar170 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar246 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 4 + 6)));
  auVar246 = vcvtdq2ps_avx(auVar246);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 5 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 6 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar274 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0xb + 6)));
  auVar274 = vcvtdq2ps_avx(auVar274);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0xc + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0xd + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar273 = ZEXT1664(auVar9);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0x12 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0x13 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar270 = ZEXT1664(auVar95);
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0x14 + 6)));
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar277._4_4_ = auVar208._0_4_;
  auVar277._0_4_ = auVar208._0_4_;
  auVar277._8_4_ = auVar208._0_4_;
  auVar277._12_4_ = auVar208._0_4_;
  auVar135 = vshufps_avx(auVar208,auVar208,0x55);
  auVar94 = vshufps_avx(auVar208,auVar208,0xaa);
  fVar170 = auVar94._0_4_;
  auVar261._0_4_ = fVar170 * auVar100._0_4_;
  fVar187 = auVar94._4_4_;
  auVar261._4_4_ = fVar187 * auVar100._4_4_;
  fVar205 = auVar94._8_4_;
  auVar261._8_4_ = fVar205 * auVar100._8_4_;
  fVar206 = auVar94._12_4_;
  auVar261._12_4_ = fVar206 * auVar100._12_4_;
  auVar244._0_4_ = auVar9._0_4_ * fVar170;
  auVar244._4_4_ = auVar9._4_4_ * fVar187;
  auVar244._8_4_ = auVar9._8_4_ * fVar205;
  auVar244._12_4_ = auVar9._12_4_ * fVar206;
  auVar227._0_4_ = auVar148._0_4_ * fVar170;
  auVar227._4_4_ = auVar148._4_4_ * fVar187;
  auVar227._8_4_ = auVar148._8_4_ * fVar205;
  auVar227._12_4_ = auVar148._12_4_ * fVar206;
  auVar94 = vfmadd231ps_fma(auVar261,auVar135,auVar7);
  auVar149 = vfmadd231ps_fma(auVar244,auVar135,auVar8);
  auVar135 = vfmadd231ps_fma(auVar227,auVar95,auVar135);
  auVar171 = vfmadd231ps_fma(auVar94,auVar277,auVar246);
  auVar267 = ZEXT1664(auVar171);
  auVar149 = vfmadd231ps_fma(auVar149,auVar277,auVar274);
  auVar189 = vfmadd231ps_fma(auVar135,auVar96,auVar277);
  auVar278._4_4_ = auVar93._0_4_;
  auVar278._0_4_ = auVar93._0_4_;
  auVar278._8_4_ = auVar93._0_4_;
  auVar278._12_4_ = auVar93._0_4_;
  auVar135 = vshufps_avx(auVar93,auVar93,0x55);
  auVar94 = vshufps_avx(auVar93,auVar93,0xaa);
  fVar170 = auVar94._0_4_;
  auVar209._0_4_ = fVar170 * auVar100._0_4_;
  fVar187 = auVar94._4_4_;
  auVar209._4_4_ = fVar187 * auVar100._4_4_;
  fVar205 = auVar94._8_4_;
  auVar209._8_4_ = fVar205 * auVar100._8_4_;
  fVar206 = auVar94._12_4_;
  auVar209._12_4_ = fVar206 * auVar100._12_4_;
  auVar134._0_4_ = auVar9._0_4_ * fVar170;
  auVar134._4_4_ = auVar9._4_4_ * fVar187;
  auVar134._8_4_ = auVar9._8_4_ * fVar205;
  auVar134._12_4_ = auVar9._12_4_ * fVar206;
  auVar94._0_4_ = auVar148._0_4_ * fVar170;
  auVar94._4_4_ = auVar148._4_4_ * fVar187;
  auVar94._8_4_ = auVar148._8_4_ * fVar205;
  auVar94._12_4_ = auVar148._12_4_ * fVar206;
  auVar7 = vfmadd231ps_fma(auVar209,auVar135,auVar7);
  auVar100 = vfmadd231ps_fma(auVar134,auVar135,auVar8);
  auVar8 = vfmadd231ps_fma(auVar94,auVar135,auVar95);
  auVar9 = vfmadd231ps_fma(auVar7,auVar278,auVar246);
  auVar95 = vfmadd231ps_fma(auVar100,auVar278,auVar274);
  auVar148 = vfmadd231ps_fma(auVar8,auVar278,auVar96);
  local_a10._8_4_ = 0x7fffffff;
  local_a10._0_8_ = 0x7fffffff7fffffff;
  local_a10._12_4_ = 0x7fffffff;
  auVar246 = vandps_avx(auVar171,local_a10);
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  auVar246 = vcmpps_avx(auVar246,auVar188,1);
  auVar7 = vblendvps_avx(auVar171,auVar188,auVar246);
  auVar246 = vandps_avx(auVar149,local_a10);
  auVar246 = vcmpps_avx(auVar246,auVar188,1);
  auVar100 = vblendvps_avx(auVar149,auVar188,auVar246);
  auVar246 = vandps_avx(local_a10,auVar189);
  auVar246 = vcmpps_avx(auVar246,auVar188,1);
  auVar246 = vblendvps_avx(auVar189,auVar188,auVar246);
  auVar274 = vrcpps_avx(auVar7);
  auVar228._8_4_ = 0x3f800000;
  auVar228._0_8_ = 0x3f8000003f800000;
  auVar228._12_4_ = 0x3f800000;
  auVar7 = vfnmadd213ps_fma(auVar7,auVar274,auVar228);
  auVar274 = vfmadd132ps_fma(auVar7,auVar274,auVar274);
  auVar7 = vrcpps_avx(auVar100);
  auVar100 = vfnmadd213ps_fma(auVar100,auVar7,auVar228);
  auVar8 = vfmadd132ps_fma(auVar100,auVar7,auVar7);
  auVar7 = vrcpps_avx(auVar246);
  auVar100 = vfnmadd213ps_fma(auVar246,auVar7,auVar228);
  auVar246._8_8_ = 0;
  auVar246._0_8_ = *(ulong *)(prim + uVar80 * 7 + 6);
  auVar246 = vpmovsxwd_avx(auVar246);
  auVar96 = vfmadd132ps_fma(auVar100,auVar7,auVar7);
  auVar246 = vcvtdq2ps_avx(auVar246);
  auVar246 = vsubps_avx(auVar246,auVar9);
  auVar189._0_4_ = auVar274._0_4_ * auVar246._0_4_;
  auVar189._4_4_ = auVar274._4_4_ * auVar246._4_4_;
  auVar189._8_4_ = auVar274._8_4_ * auVar246._8_4_;
  auVar189._12_4_ = auVar274._12_4_ * auVar246._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar80 * 9 + 6);
  auVar246 = vpmovsxwd_avx(auVar7);
  auVar246 = vcvtdq2ps_avx(auVar246);
  auVar7 = vsubps_avx(auVar246,auVar9);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar80 * 0xe + 6);
  auVar246 = vpmovsxwd_avx(auVar100);
  auVar210._0_4_ = auVar274._0_4_ * auVar7._0_4_;
  auVar210._4_4_ = auVar274._4_4_ * auVar7._4_4_;
  auVar210._8_4_ = auVar274._8_4_ * auVar7._8_4_;
  auVar210._12_4_ = auVar274._12_4_ * auVar7._12_4_;
  auVar246 = vcvtdq2ps_avx(auVar246);
  auVar246 = vsubps_avx(auVar246,auVar95);
  auVar222._0_4_ = auVar8._0_4_ * auVar246._0_4_;
  auVar222._4_4_ = auVar8._4_4_ * auVar246._4_4_;
  auVar222._8_4_ = auVar8._8_4_ * auVar246._8_4_;
  auVar222._12_4_ = auVar8._12_4_ * auVar246._12_4_;
  auVar149._1_3_ = 0;
  auVar149[0] = PVar3;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar246 = vpmovsxwd_avx(auVar274);
  auVar246 = vcvtdq2ps_avx(auVar246);
  auVar246 = vsubps_avx(auVar246,auVar95);
  auVar135._0_4_ = auVar8._0_4_ * auVar246._0_4_;
  auVar135._4_4_ = auVar8._4_4_ * auVar246._4_4_;
  auVar135._8_4_ = auVar8._8_4_ * auVar246._8_4_;
  auVar135._12_4_ = auVar8._12_4_ * auVar246._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar80 * 0x15 + 6);
  auVar246 = vpmovsxwd_avx(auVar8);
  auVar246 = vcvtdq2ps_avx(auVar246);
  auVar7 = vsubps_avx(auVar246,auVar148);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar80 * 0x17 + 6);
  auVar246 = vpmovsxwd_avx(auVar9);
  auVar171._0_4_ = auVar96._0_4_ * auVar7._0_4_;
  auVar171._4_4_ = auVar96._4_4_ * auVar7._4_4_;
  auVar171._8_4_ = auVar96._8_4_ * auVar7._8_4_;
  auVar171._12_4_ = auVar96._12_4_ * auVar7._12_4_;
  auVar246 = vcvtdq2ps_avx(auVar246);
  auVar246 = vsubps_avx(auVar246,auVar148);
  auVar95._0_4_ = auVar96._0_4_ * auVar246._0_4_;
  auVar95._4_4_ = auVar96._4_4_ * auVar246._4_4_;
  auVar95._8_4_ = auVar96._8_4_ * auVar246._8_4_;
  auVar95._12_4_ = auVar96._12_4_ * auVar246._12_4_;
  auVar246 = vpminsd_avx(auVar189,auVar210);
  auVar7 = vpminsd_avx(auVar222,auVar135);
  auVar246 = vmaxps_avx(auVar246,auVar7);
  auVar7 = vpminsd_avx(auVar171,auVar95);
  uVar85 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar245._4_4_ = uVar85;
  auVar245._0_4_ = uVar85;
  auVar245._8_4_ = uVar85;
  auVar245._12_4_ = uVar85;
  auVar7 = vmaxps_avx(auVar7,auVar245);
  auVar246 = vmaxps_avx(auVar246,auVar7);
  local_5e0._0_4_ = auVar246._0_4_ * 0.99999964;
  local_5e0._4_4_ = auVar246._4_4_ * 0.99999964;
  local_5e0._8_4_ = auVar246._8_4_ * 0.99999964;
  local_5e0._12_4_ = auVar246._12_4_ * 0.99999964;
  auVar246 = vpmaxsd_avx(auVar189,auVar210);
  auVar7 = vpmaxsd_avx(auVar222,auVar135);
  auVar246 = vminps_avx(auVar246,auVar7);
  auVar7 = vpmaxsd_avx(auVar171,auVar95);
  fVar170 = (ray->super_RayK<1>).tfar;
  auVar148._4_4_ = fVar170;
  auVar148._0_4_ = fVar170;
  auVar148._8_4_ = fVar170;
  auVar148._12_4_ = fVar170;
  auVar7 = vminps_avx(auVar7,auVar148);
  auVar246 = vminps_avx(auVar246,auVar7);
  auVar149[4] = PVar3;
  auVar149._5_3_ = 0;
  auVar149[8] = PVar3;
  auVar149._9_3_ = 0;
  auVar149[0xc] = PVar3;
  auVar149._13_3_ = 0;
  auVar7 = vpcmpgtd_avx(auVar149,_DAT_01f4ad30);
  auVar96._0_4_ = auVar246._0_4_ * 1.0000004;
  auVar96._4_4_ = auVar246._4_4_ * 1.0000004;
  auVar96._8_4_ = auVar246._8_4_ * 1.0000004;
  auVar96._12_4_ = auVar246._12_4_ * 1.0000004;
  auVar246 = vcmpps_avx(local_5e0,auVar96,2);
  auVar246 = vandps_avx(auVar246,auVar7);
  uVar85 = vmovmskps_avx(auVar246);
  uVar86 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),uVar85);
  auVar109._16_16_ = mm_lookupmask_ps._240_16_;
  auVar109._0_16_ = mm_lookupmask_ps._240_16_;
  local_320 = vblendps_avx(auVar109,ZEXT832(0) << 0x20,0x80);
  local_828 = prim;
LAB_0110feda:
  if (uVar86 == 0) {
    return;
  }
  lVar82 = 0;
  for (uVar81 = uVar86; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    lVar82 = lVar82 + 1;
  }
  uVar86 = uVar86 - 1 & uVar86;
  uVar85 = *(undefined4 *)(local_828 + lVar82 * 4 + 6);
  uVar81 = (ulong)(uint)((int)lVar82 << 6);
  auVar246 = *(undefined1 (*) [16])(prim + uVar81 + uVar80 * 0x19 + 0x16);
  if (uVar86 != 0) {
    uVar84 = uVar86 - 1 & uVar86;
    for (uVar12 = uVar86; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
    }
    if (uVar84 != 0) {
      for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar7 = *(undefined1 (*) [16])(prim + uVar81 + uVar80 * 0x19 + 0x26);
  auVar100 = *(undefined1 (*) [16])(prim + uVar81 + uVar80 * 0x19 + 0x36);
  auVar274 = *(undefined1 (*) [16])(prim + uVar81 + uVar80 * 0x19 + 0x46);
  auVar211._0_4_ = (auVar246._0_4_ + auVar7._0_4_ + auVar100._0_4_ + auVar274._0_4_) * 0.25;
  auVar211._4_4_ = (auVar246._4_4_ + auVar7._4_4_ + auVar100._4_4_ + auVar274._4_4_) * 0.25;
  auVar211._8_4_ = (auVar246._8_4_ + auVar7._8_4_ + auVar100._8_4_ + auVar274._8_4_) * 0.25;
  auVar211._12_4_ = (auVar246._12_4_ + auVar7._12_4_ + auVar100._12_4_ + auVar274._12_4_) * 0.25;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar8 = vsubps_avx(auVar211,(undefined1  [16])aVar1);
  auVar8 = vdpps_avx(auVar8,(undefined1  [16])aVar2,0x7f);
  auVar9 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  uVar79 = *(uint *)(local_828 + 2);
  auVar96 = vrcpss_avx(auVar9,auVar9);
  auVar9 = vfnmadd213ss_fma(auVar96,auVar9,ZEXT416(0x40000000));
  auVar253 = ZEXT1664(auVar9);
  fVar170 = auVar8._0_4_ * auVar96._0_4_ * auVar9._0_4_;
  local_840 = ZEXT416((uint)fVar170);
  auVar212._4_4_ = fVar170;
  auVar212._0_4_ = fVar170;
  auVar212._8_4_ = fVar170;
  auVar212._12_4_ = fVar170;
  fStack_810 = fVar170;
  _local_820 = auVar212;
  fStack_80c = fVar170;
  fStack_808 = fVar170;
  fStack_804 = fVar170;
  auVar8 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar212);
  auVar8 = vblendps_avx(auVar8,_DAT_01f45a50,8);
  local_9d0 = vsubps_avx(auVar246,auVar8);
  local_9e0 = vsubps_avx(auVar100,auVar8);
  local_9f0 = vsubps_avx(auVar7,auVar8);
  _local_a00 = vsubps_avx(auVar274,auVar8);
  auVar246 = vmovshdup_avx(local_9d0);
  local_1e0 = auVar246._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar246 = vshufps_avx(local_9d0,local_9d0,0xaa);
  local_200 = auVar246._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar246 = vshufps_avx(local_9d0,local_9d0,0xff);
  local_3c0 = auVar246._0_8_;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  auVar246 = vmovshdup_avx(local_9f0);
  local_3e0 = auVar246._0_8_;
  uStack_3d8 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3c8 = local_3e0;
  auVar246 = vshufps_avx(local_9f0,local_9f0,0xaa);
  local_400 = auVar246._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar246 = vshufps_avx(local_9f0,local_9f0,0xff);
  local_220 = auVar246._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar246 = vmovshdup_avx(local_9e0);
  local_420 = auVar246._0_8_;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  auVar246 = vshufps_avx(local_9e0,local_9e0,0xaa);
  local_440 = auVar246._0_8_;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  auVar246 = vshufps_avx(local_9e0,local_9e0,0xff);
  local_460 = auVar246._0_8_;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  auVar246 = vmovshdup_avx(_local_a00);
  local_480 = auVar246._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar246 = vshufps_avx(_local_a00,_local_a00,0xaa);
  local_4a0 = auVar246._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar246 = vshufps_avx(_local_a00,_local_a00,0xff);
  local_4c0 = auVar246._0_8_;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  auVar97._0_4_ = aVar2.x * aVar2.x;
  auVar97._4_4_ = aVar2.y * aVar2.y;
  auVar97._8_4_ = aVar2.z * aVar2.z;
  auVar97._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar246 = vshufps_avx(auVar97,auVar97,0xaa);
  uVar91 = auVar246._0_8_;
  auVar217._8_8_ = uVar91;
  auVar217._0_8_ = uVar91;
  auVar217._16_8_ = uVar91;
  auVar217._24_8_ = uVar91;
  uVar90 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_6a0._4_4_ = uVar90;
  local_6a0._0_4_ = uVar90;
  fStack_698 = (float)uVar90;
  fStack_694 = (float)uVar90;
  fStack_690 = (float)uVar90;
  fStack_68c = (float)uVar90;
  fStack_688 = (float)uVar90;
  register0x000013dc = uVar90;
  auVar233 = ZEXT3264(_local_6a0);
  auVar246 = vfmadd231ps_fma(auVar217,_local_6a0,_local_6a0);
  uVar90 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_600._4_4_ = uVar90;
  local_600._0_4_ = uVar90;
  fStack_5f8 = (float)uVar90;
  fStack_5f4 = (float)uVar90;
  fStack_5f0 = (float)uVar90;
  fStack_5ec = (float)uVar90;
  fStack_5e8 = (float)uVar90;
  register0x0000141c = uVar90;
  auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),_local_600,_local_600);
  uVar81 = 0;
  local_aec = 1;
  local_6c0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_6bc = local_6c0;
  fStack_6b8 = local_6c0;
  fStack_6b4 = local_6c0;
  fStack_6b0 = local_6c0;
  fStack_6ac = local_6c0;
  fStack_6a8 = local_6c0;
  fStack_6a4 = local_6c0;
  local_4e0 = local_9d0._0_4_;
  uStack_4dc = local_4e0;
  uStack_4d8 = local_4e0;
  uStack_4d4 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4cc = local_4e0;
  uStack_4c8 = local_4e0;
  uStack_4c4 = local_4e0;
  local_260 = local_9f0._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_500 = local_9e0._0_4_;
  uStack_4fc = local_500;
  uStack_4f8 = local_500;
  uStack_4f4 = local_500;
  uStack_4f0 = local_500;
  uStack_4ec = local_500;
  uStack_4e8 = local_500;
  uStack_4e4 = local_500;
  local_520 = local_a00._0_4_;
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  local_700._8_4_ = 0x7fffffff;
  local_700._0_8_ = 0x7fffffff7fffffff;
  local_700._12_4_ = 0x7fffffff;
  local_700._16_4_ = 0x7fffffff;
  local_700._20_4_ = 0x7fffffff;
  local_700._24_4_ = 0x7fffffff;
  local_700._28_4_ = 0x7fffffff;
  local_540 = vandps_avx(ZEXT1632(auVar246),local_700);
  local_5d0 = ZEXT816(0x3f80000000000000);
  local_240 = ZEXT1632(auVar246);
  do {
    auVar246 = vmovshdup_avx(local_5d0);
    auVar246 = vsubps_avx(auVar246,local_5d0);
    local_780._0_4_ = auVar246._0_4_;
    fVar258 = local_780._0_4_ * 0.04761905;
    local_960._0_16_ = ZEXT416((uint)fVar258);
    uVar90 = local_5d0._0_4_;
    local_760._4_4_ = uVar90;
    local_760._0_4_ = uVar90;
    local_760._8_4_ = uVar90;
    local_760._12_4_ = uVar90;
    local_760._16_4_ = uVar90;
    local_760._20_4_ = uVar90;
    local_760._24_4_ = uVar90;
    local_760._28_4_ = uVar90;
    local_780._4_4_ = local_780._0_4_;
    local_780._8_4_ = local_780._0_4_;
    local_780._12_4_ = local_780._0_4_;
    local_780._16_4_ = local_780._0_4_;
    local_780._20_4_ = local_780._0_4_;
    local_780._24_4_ = local_780._0_4_;
    local_780._28_4_ = local_780._0_4_;
    auVar246 = vfmadd231ps_fma(local_760,local_780,_DAT_01f7b040);
    auVar110._8_4_ = 0x3f800000;
    auVar110._0_8_ = 0x3f8000003f800000;
    auVar110._12_4_ = 0x3f800000;
    auVar110._16_4_ = 0x3f800000;
    auVar110._20_4_ = 0x3f800000;
    auVar110._24_4_ = 0x3f800000;
    auVar110._28_4_ = 0x3f800000;
    auVar109 = vsubps_avx(auVar110,ZEXT1632(auVar246));
    fVar187 = auVar109._0_4_;
    fVar206 = auVar109._4_4_;
    fVar219 = auVar109._8_4_;
    fVar221 = auVar109._12_4_;
    fVar126 = auVar109._16_4_;
    fVar128 = auVar109._20_4_;
    fVar130 = auVar109._24_4_;
    fVar88 = fVar187 * fVar187 * fVar187;
    fVar125 = fVar206 * fVar206 * fVar206;
    fVar127 = fVar219 * fVar219 * fVar219;
    fVar129 = fVar221 * fVar221 * fVar221;
    fVar131 = fVar126 * fVar126 * fVar126;
    fVar132 = fVar128 * fVar128 * fVar128;
    fVar133 = fVar130 * fVar130 * fVar130;
    fVar205 = auVar246._0_4_;
    fVar207 = auVar246._4_4_;
    fVar220 = auVar246._8_4_;
    fVar89 = auVar246._12_4_;
    fVar147 = fVar205 * fVar205 * fVar205;
    fVar167 = fVar207 * fVar207 * fVar207;
    fVar168 = fVar220 * fVar220 * fVar220;
    fVar169 = fVar89 * fVar89 * fVar89;
    fVar243 = fVar187 * fVar205;
    fVar254 = fVar206 * fVar207;
    fVar255 = fVar219 * fVar220;
    fVar256 = fVar221 * fVar89;
    fVar257 = fVar126 * 0.0;
    fVar259 = fVar128 * 0.0;
    fVar260 = fVar130 * 0.0;
    fVar170 = auVar273._28_4_;
    fVar268 = auVar267._28_4_ + fVar170;
    auVar6._4_4_ = fVar125 * 0.16666667;
    auVar6._0_4_ = fVar88 * 0.16666667;
    auVar6._8_4_ = fVar127 * 0.16666667;
    auVar6._12_4_ = fVar129 * 0.16666667;
    auVar6._16_4_ = fVar131 * 0.16666667;
    auVar6._20_4_ = fVar132 * 0.16666667;
    auVar6._24_4_ = fVar133 * 0.16666667;
    auVar6._28_4_ = fVar268 + 1.0;
    auVar199._4_4_ =
         (fVar206 * fVar254 * 12.0 + fVar254 * fVar207 * 6.0 + fVar167 + fVar125 * 4.0) * 0.16666667
    ;
    auVar199._0_4_ =
         (fVar187 * fVar243 * 12.0 + fVar243 * fVar205 * 6.0 + fVar147 + fVar88 * 4.0) * 0.16666667;
    auVar199._8_4_ =
         (fVar219 * fVar255 * 12.0 + fVar255 * fVar220 * 6.0 + fVar168 + fVar127 * 4.0) * 0.16666667
    ;
    auVar199._12_4_ =
         (fVar221 * fVar256 * 12.0 + fVar256 * fVar89 * 6.0 + fVar169 + fVar129 * 4.0) * 0.16666667;
    auVar199._16_4_ =
         (fVar126 * fVar257 * 12.0 + fVar257 * 0.0 * 6.0 + fVar131 * 4.0 + 0.0) * 0.16666667;
    auVar199._20_4_ =
         (fVar128 * fVar259 * 12.0 + fVar259 * 0.0 * 6.0 + fVar132 * 4.0 + 0.0) * 0.16666667;
    auVar199._24_4_ =
         (fVar130 * fVar260 * 12.0 + fVar260 * 0.0 * 6.0 + fVar133 * 4.0 + 0.0) * 0.16666667;
    auVar199._28_4_ = auVar270._28_4_;
    auVar116._4_4_ =
         (fVar167 * 4.0 + fVar125 + fVar254 * fVar207 * 12.0 + fVar206 * fVar254 * 6.0) * 0.16666667
    ;
    auVar116._0_4_ =
         (fVar147 * 4.0 + fVar88 + fVar243 * fVar205 * 12.0 + fVar187 * fVar243 * 6.0) * 0.16666667;
    auVar116._8_4_ =
         (fVar168 * 4.0 + fVar127 + fVar255 * fVar220 * 12.0 + fVar219 * fVar255 * 6.0) * 0.16666667
    ;
    auVar116._12_4_ =
         (fVar169 * 4.0 + fVar129 + fVar256 * fVar89 * 12.0 + fVar221 * fVar256 * 6.0) * 0.16666667;
    auVar116._16_4_ = (fVar131 + 0.0 + fVar257 * 0.0 * 12.0 + fVar126 * fVar257 * 6.0) * 0.16666667;
    auVar116._20_4_ = (fVar132 + 0.0 + fVar259 * 0.0 * 12.0 + fVar128 * fVar259 * 6.0) * 0.16666667;
    auVar116._24_4_ = (fVar133 + 0.0 + fVar260 * 0.0 * 12.0 + fVar130 * fVar260 * 6.0) * 0.16666667;
    auVar116._28_4_ = fVar170;
    fVar147 = fVar147 * 0.16666667;
    fVar167 = fVar167 * 0.16666667;
    fVar168 = fVar168 * 0.16666667;
    fVar169 = fVar169 * 0.16666667;
    auVar141._4_4_ = fVar167 * fStack_51c;
    auVar141._0_4_ = fVar147 * local_520;
    auVar141._8_4_ = fVar168 * fStack_518;
    auVar141._12_4_ = fVar169 * fStack_514;
    auVar141._16_4_ = fStack_510 * 0.0;
    auVar141._20_4_ = fStack_50c * 0.0;
    auVar141._24_4_ = fStack_508 * 0.0;
    auVar141._28_4_ = 0x3f800000;
    auVar13._4_4_ = fVar167 * local_480._4_4_;
    auVar13._0_4_ = fVar147 * (float)local_480;
    auVar13._8_4_ = fVar168 * (float)uStack_478;
    auVar13._12_4_ = fVar169 * uStack_478._4_4_;
    auVar13._16_4_ = (float)uStack_470 * 0.0;
    auVar13._20_4_ = uStack_470._4_4_ * 0.0;
    auVar13._24_4_ = (float)uStack_468 * 0.0;
    auVar13._28_4_ = 0x40800000;
    auVar14._4_4_ = fVar167 * local_4a0._4_4_;
    auVar14._0_4_ = fVar147 * (float)local_4a0;
    auVar14._8_4_ = fVar168 * (float)uStack_498;
    auVar14._12_4_ = fVar169 * uStack_498._4_4_;
    auVar14._16_4_ = (float)uStack_490 * 0.0;
    auVar14._20_4_ = uStack_490._4_4_ * 0.0;
    auVar14._24_4_ = (float)uStack_488 * 0.0;
    auVar14._28_4_ = fVar268 + DAT_01f7b040._28_4_ + 0.0;
    auVar15._4_4_ = fVar167 * local_4c0._4_4_;
    auVar15._0_4_ = fVar147 * (float)local_4c0;
    auVar15._8_4_ = fVar168 * (float)uStack_4b8;
    auVar15._12_4_ = fVar169 * uStack_4b8._4_4_;
    auVar15._16_4_ = (float)uStack_4b0 * 0.0;
    auVar15._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar15._24_4_ = (float)uStack_4a8 * 0.0;
    auVar15._28_4_ = 0;
    auVar111._4_4_ = uStack_4fc;
    auVar111._0_4_ = local_500;
    auVar111._8_4_ = uStack_4f8;
    auVar111._12_4_ = uStack_4f4;
    auVar111._16_4_ = uStack_4f0;
    auVar111._20_4_ = uStack_4ec;
    auVar111._24_4_ = uStack_4e8;
    auVar111._28_4_ = uStack_4e4;
    auVar246 = vfmadd231ps_fma(auVar141,auVar116,auVar111);
    auVar64._8_8_ = uStack_418;
    auVar64._0_8_ = local_420;
    auVar64._16_8_ = uStack_410;
    auVar64._24_8_ = uStack_408;
    auVar7 = vfmadd231ps_fma(auVar13,auVar116,auVar64);
    auVar62._8_8_ = uStack_438;
    auVar62._0_8_ = local_440;
    auVar62._16_8_ = uStack_430;
    auVar62._24_8_ = uStack_428;
    auVar100 = vfmadd231ps_fma(auVar14,auVar116,auVar62);
    auVar60._8_8_ = uStack_458;
    auVar60._0_8_ = local_460;
    auVar60._16_8_ = uStack_450;
    auVar60._24_8_ = uStack_448;
    auVar274 = vfmadd231ps_fma(auVar15,auVar116,auVar60);
    auVar73._4_4_ = uStack_25c;
    auVar73._0_4_ = local_260;
    auVar73._8_4_ = uStack_258;
    auVar73._12_4_ = uStack_254;
    auVar73._16_4_ = uStack_250;
    auVar73._20_4_ = uStack_24c;
    auVar73._24_4_ = uStack_248;
    auVar73._28_4_ = uStack_244;
    auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar199,auVar73);
    auVar68._8_8_ = uStack_3d8;
    auVar68._0_8_ = local_3e0;
    auVar68._16_8_ = uStack_3d0;
    auVar68._24_8_ = uStack_3c8;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar199,auVar68);
    auVar66._8_8_ = uStack_3f8;
    auVar66._0_8_ = local_400;
    auVar66._16_8_ = uStack_3f0;
    auVar66._24_8_ = uStack_3e8;
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar199,auVar66);
    auVar74._8_8_ = uStack_218;
    auVar74._0_8_ = local_220;
    auVar74._16_8_ = uStack_210;
    auVar74._24_8_ = uStack_208;
    auVar274 = vfmadd231ps_fma(ZEXT1632(auVar274),auVar74,auVar199);
    auVar58._4_4_ = uStack_4dc;
    auVar58._0_4_ = local_4e0;
    auVar58._8_4_ = uStack_4d8;
    auVar58._12_4_ = uStack_4d4;
    auVar58._16_4_ = uStack_4d0;
    auVar58._20_4_ = uStack_4cc;
    auVar58._24_4_ = uStack_4c8;
    auVar58._28_4_ = uStack_4c4;
    auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar6,auVar58);
    auVar111 = ZEXT1632(auVar246);
    auVar76._8_8_ = uStack_1d8;
    auVar76._0_8_ = local_1e0;
    auVar76._16_8_ = uStack_1d0;
    auVar76._24_8_ = uStack_1c8;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar6,auVar76);
    auVar75._8_8_ = uStack_1f8;
    auVar75._0_8_ = local_200;
    auVar75._16_8_ = uStack_1f0;
    auVar75._24_8_ = uStack_1e8;
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar6,auVar75);
    auVar70._8_8_ = uStack_3b8;
    auVar70._0_8_ = local_3c0;
    auVar70._16_8_ = uStack_3b0;
    auVar70._24_8_ = uStack_3a8;
    auVar274 = vfmadd231ps_fma(ZEXT1632(auVar274),auVar6,auVar70);
    auVar223._0_4_ = -fVar205 * fVar205;
    auVar223._4_4_ = -fVar207 * fVar207;
    auVar223._8_4_ = -fVar220 * fVar220;
    auVar223._12_4_ = -fVar89 * fVar89;
    auVar223._16_4_ = 0x80000000;
    auVar223._20_4_ = 0x80000000;
    auVar223._24_4_ = 0x80000000;
    auVar223._28_4_ = 0;
    auVar200._4_4_ = fVar254 * 4.0;
    auVar200._0_4_ = fVar243 * 4.0;
    auVar200._8_4_ = fVar255 * 4.0;
    auVar200._12_4_ = fVar256 * 4.0;
    auVar200._16_4_ = fVar257 * 4.0;
    auVar200._20_4_ = fVar259 * 4.0;
    auVar200._24_4_ = fVar260 * 4.0;
    auVar200._28_4_ = auVar253._28_4_;
    auVar217 = vsubps_avx(auVar223,auVar200);
    auVar159._4_4_ = fVar206 * -fVar206 * 0.5;
    auVar159._0_4_ = fVar187 * -fVar187 * 0.5;
    auVar159._8_4_ = fVar219 * -fVar219 * 0.5;
    auVar159._12_4_ = fVar221 * -fVar221 * 0.5;
    auVar159._16_4_ = fVar126 * -fVar126 * 0.5;
    auVar159._20_4_ = fVar128 * -fVar128 * 0.5;
    auVar159._24_4_ = fVar130 * -fVar130 * 0.5;
    auVar159._28_4_ = auVar109._28_4_;
    auVar285._4_4_ = auVar217._4_4_ * 0.5;
    auVar285._0_4_ = auVar217._0_4_ * 0.5;
    auVar285._8_4_ = auVar217._8_4_ * 0.5;
    auVar285._12_4_ = auVar217._12_4_ * 0.5;
    auVar285._16_4_ = auVar217._16_4_ * 0.5;
    auVar285._20_4_ = auVar217._20_4_ * 0.5;
    auVar285._24_4_ = auVar217._24_4_ * 0.5;
    auVar285._28_4_ = auVar217._28_4_;
    auVar10._4_4_ = (fVar254 * 4.0 + fVar206 * fVar206) * 0.5;
    auVar10._0_4_ = (fVar243 * 4.0 + fVar187 * fVar187) * 0.5;
    auVar10._8_4_ = (fVar255 * 4.0 + fVar219 * fVar219) * 0.5;
    auVar10._12_4_ = (fVar256 * 4.0 + fVar221 * fVar221) * 0.5;
    auVar10._16_4_ = (fVar257 * 4.0 + fVar126 * fVar126) * 0.5;
    auVar10._20_4_ = (fVar259 * 4.0 + fVar128 * fVar128) * 0.5;
    auVar10._24_4_ = (fVar260 * 4.0 + fVar130 * fVar130) * 0.5;
    auVar10._28_4_ = auVar253._28_4_ + auVar233._28_4_;
    fVar187 = fVar205 * fVar205 * 0.5;
    fVar205 = fVar207 * fVar207 * 0.5;
    fVar206 = fVar220 * fVar220 * 0.5;
    fVar207 = fVar89 * fVar89 * 0.5;
    auVar16._4_4_ = fVar205 * fStack_51c;
    auVar16._0_4_ = fVar187 * local_520;
    auVar16._8_4_ = fVar206 * fStack_518;
    auVar16._12_4_ = fVar207 * fStack_514;
    auVar16._16_4_ = fStack_510 * 0.0;
    auVar16._20_4_ = fStack_50c * 0.0;
    auVar16._24_4_ = fStack_508 * 0.0;
    auVar16._28_4_ = 0x3f000000;
    auVar17._4_4_ = fVar205 * local_480._4_4_;
    auVar17._0_4_ = fVar187 * (float)local_480;
    auVar17._8_4_ = fVar206 * (float)uStack_478;
    auVar17._12_4_ = fVar207 * uStack_478._4_4_;
    auVar17._16_4_ = (float)uStack_470 * 0.0;
    auVar17._20_4_ = uStack_470._4_4_ * 0.0;
    auVar17._24_4_ = (float)uStack_468 * 0.0;
    auVar17._28_4_ = 0x80000000;
    auVar18._4_4_ = fVar205 * local_4a0._4_4_;
    auVar18._0_4_ = fVar187 * (float)local_4a0;
    auVar18._8_4_ = fVar206 * (float)uStack_498;
    auVar18._12_4_ = fVar207 * uStack_498._4_4_;
    auVar18._16_4_ = (float)uStack_490 * 0.0;
    auVar18._20_4_ = uStack_490._4_4_ * 0.0;
    auVar18._24_4_ = (float)uStack_488 * 0.0;
    auVar18._28_4_ = auVar270._28_4_;
    auVar19._4_4_ = fVar205 * local_4c0._4_4_;
    auVar19._0_4_ = fVar187 * (float)local_4c0;
    auVar19._8_4_ = fVar206 * (float)uStack_4b8;
    auVar19._12_4_ = fVar207 * uStack_4b8._4_4_;
    auVar19._16_4_ = (float)uStack_4b0 * 0.0;
    auVar19._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar19._24_4_ = (float)uStack_4a8 * 0.0;
    auVar19._28_4_ = fVar170;
    auVar57._4_4_ = uStack_4fc;
    auVar57._0_4_ = local_500;
    auVar57._8_4_ = uStack_4f8;
    auVar57._12_4_ = uStack_4f4;
    auVar57._16_4_ = uStack_4f0;
    auVar57._20_4_ = uStack_4ec;
    auVar57._24_4_ = uStack_4e8;
    auVar57._28_4_ = uStack_4e4;
    auVar246 = vfmadd231ps_fma(auVar16,auVar10,auVar57);
    auVar65._8_8_ = uStack_418;
    auVar65._0_8_ = local_420;
    auVar65._16_8_ = uStack_410;
    auVar65._24_8_ = uStack_408;
    auVar8 = vfmadd231ps_fma(auVar17,auVar10,auVar65);
    auVar63._8_8_ = uStack_438;
    auVar63._0_8_ = local_440;
    auVar63._16_8_ = uStack_430;
    auVar63._24_8_ = uStack_428;
    auVar9 = vfmadd231ps_fma(auVar18,auVar10,auVar63);
    auVar61._8_8_ = uStack_458;
    auVar61._0_8_ = local_460;
    auVar61._16_8_ = uStack_450;
    auVar61._24_8_ = uStack_448;
    auVar96 = vfmadd231ps_fma(auVar19,auVar10,auVar61);
    auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar285,auVar73);
    auVar69._8_8_ = uStack_3d8;
    auVar69._0_8_ = local_3e0;
    auVar69._16_8_ = uStack_3d0;
    auVar69._24_8_ = uStack_3c8;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar285,auVar69);
    auVar67._8_8_ = uStack_3f8;
    auVar67._0_8_ = local_400;
    auVar67._16_8_ = uStack_3f0;
    auVar67._24_8_ = uStack_3e8;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar285,auVar67);
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar74,auVar285);
    auVar59._4_4_ = uStack_4dc;
    auVar59._0_4_ = local_4e0;
    auVar59._8_4_ = uStack_4d8;
    auVar59._12_4_ = uStack_4d4;
    auVar59._16_4_ = uStack_4d0;
    auVar59._20_4_ = uStack_4cc;
    auVar59._24_4_ = uStack_4c8;
    auVar59._28_4_ = uStack_4c4;
    auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar159,auVar59);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar159,auVar76);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar159,auVar75);
    auVar71._8_8_ = uStack_3b8;
    auVar71._0_8_ = local_3c0;
    auVar71._16_8_ = uStack_3b0;
    auVar71._24_8_ = uStack_3a8;
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar159,auVar71);
    fVar207 = auVar246._0_4_ * fVar258;
    fVar219 = auVar246._4_4_ * fVar258;
    local_720._4_4_ = fVar219;
    local_720._0_4_ = fVar207;
    fVar220 = auVar246._8_4_ * fVar258;
    local_720._8_4_ = fVar220;
    fVar221 = auVar246._12_4_ * fVar258;
    local_720._12_4_ = fVar221;
    local_720._16_4_ = fVar258 * 0.0;
    local_720._20_4_ = fVar258 * 0.0;
    local_720._24_4_ = fVar258 * 0.0;
    local_720._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    local_9a0._0_4_ = auVar8._0_4_ * fVar258;
    local_9a0._4_4_ = auVar8._4_4_ * fVar258;
    local_9a0._8_4_ = auVar8._8_4_ * fVar258;
    local_9a0._12_4_ = auVar8._12_4_ * fVar258;
    local_9a0._16_4_ = fVar258 * 0.0;
    local_9a0._20_4_ = fVar258 * 0.0;
    local_9a0._24_4_ = fVar258 * 0.0;
    local_9a0._28_4_ = 0;
    fVar89 = auVar9._0_4_ * fVar258;
    fVar126 = auVar9._4_4_ * fVar258;
    local_740._4_4_ = fVar126;
    local_740._0_4_ = fVar89;
    fVar128 = auVar9._8_4_ * fVar258;
    local_740._8_4_ = fVar128;
    fVar130 = auVar9._12_4_ * fVar258;
    local_740._12_4_ = fVar130;
    fVar88 = fVar258 * 0.0;
    local_740._16_4_ = fVar88;
    fVar127 = fVar258 * 0.0;
    local_740._20_4_ = fVar127;
    fVar131 = fVar258 * 0.0;
    local_740._24_4_ = fVar131;
    local_740._28_4_ = 0x40800000;
    fVar170 = auVar96._0_4_ * fVar258;
    fVar187 = auVar96._4_4_ * fVar258;
    auVar20._4_4_ = fVar187;
    auVar20._0_4_ = fVar170;
    fVar205 = auVar96._8_4_ * fVar258;
    auVar20._8_4_ = fVar205;
    fVar206 = auVar96._12_4_ * fVar258;
    auVar20._12_4_ = fVar206;
    auVar20._16_4_ = fVar258 * 0.0;
    auVar20._20_4_ = fVar258 * 0.0;
    auVar20._24_4_ = fVar258 * 0.0;
    auVar20._28_4_ = fVar258;
    local_860 = vpermps_avx2(_DAT_01fb7720,auVar111);
    _local_880 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar100));
    local_2e0 = vsubps_avx(local_860,auVar111);
    local_2c0 = vsubps_avx(_local_880,ZEXT1632(auVar100));
    fVar125 = local_2c0._0_4_;
    fVar129 = local_2c0._4_4_;
    auVar21._4_4_ = fVar129 * fVar219;
    auVar21._0_4_ = fVar125 * fVar207;
    fVar132 = local_2c0._8_4_;
    auVar21._8_4_ = fVar132 * fVar220;
    fVar169 = local_2c0._12_4_;
    auVar21._12_4_ = fVar169 * fVar221;
    fVar221 = local_2c0._16_4_;
    auVar21._16_4_ = fVar221 * fVar258 * 0.0;
    fVar254 = local_2c0._20_4_;
    auVar21._20_4_ = fVar254 * fVar258 * 0.0;
    fVar255 = local_2c0._24_4_;
    auVar21._24_4_ = fVar255 * fVar258 * 0.0;
    auVar21._28_4_ = local_860._28_4_;
    auVar246 = vfmsub231ps_fma(auVar21,local_740,local_2e0);
    local_980 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar7));
    local_300 = vsubps_avx(local_980,ZEXT1632(auVar7));
    fVar256 = local_2e0._0_4_;
    fVar257 = local_2e0._4_4_;
    auVar22._4_4_ = fVar257 * local_9a0._4_4_;
    auVar22._0_4_ = fVar256 * (float)local_9a0._0_4_;
    fVar259 = local_2e0._8_4_;
    auVar22._8_4_ = fVar259 * local_9a0._8_4_;
    fVar260 = local_2e0._12_4_;
    auVar22._12_4_ = fVar260 * local_9a0._12_4_;
    fVar268 = local_2e0._16_4_;
    auVar22._16_4_ = fVar268 * local_9a0._16_4_;
    fVar275 = local_2e0._20_4_;
    auVar22._20_4_ = fVar275 * local_9a0._20_4_;
    fVar276 = local_2e0._24_4_;
    auVar22._24_4_ = fVar276 * local_9a0._24_4_;
    auVar22._28_4_ = local_980._28_4_;
    auVar8 = vfmsub231ps_fma(auVar22,local_720,local_300);
    auVar246 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar8._12_4_ * auVar8._12_4_,
                                                  CONCAT48(auVar8._8_4_ * auVar8._8_4_,
                                                           CONCAT44(auVar8._4_4_ * auVar8._4_4_,
                                                                    auVar8._0_4_ * auVar8._0_4_)))),
                               ZEXT1632(auVar246),ZEXT1632(auVar246));
    fVar133 = local_300._0_4_;
    auVar224._0_4_ = fVar133 * fVar89;
    fVar147 = local_300._4_4_;
    auVar224._4_4_ = fVar147 * fVar126;
    fVar167 = local_300._8_4_;
    auVar224._8_4_ = fVar167 * fVar128;
    fVar168 = local_300._12_4_;
    auVar224._12_4_ = fVar168 * fVar130;
    fVar243 = local_300._16_4_;
    auVar224._16_4_ = fVar243 * fVar88;
    fVar287 = local_300._20_4_;
    auVar224._20_4_ = fVar287 * fVar127;
    fVar288 = local_300._24_4_;
    auVar224._24_4_ = fVar288 * fVar131;
    auVar224._28_4_ = 0;
    auVar8 = vfmsub231ps_fma(auVar224,local_9a0,local_2c0);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar246),ZEXT1632(auVar8),ZEXT1632(auVar8));
    auVar225._0_4_ = fVar125 * fVar125;
    auVar225._4_4_ = fVar129 * fVar129;
    auVar225._8_4_ = fVar132 * fVar132;
    auVar225._12_4_ = fVar169 * fVar169;
    auVar225._16_4_ = fVar221 * fVar221;
    auVar225._20_4_ = fVar254 * fVar254;
    auVar225._24_4_ = fVar255 * fVar255;
    auVar225._28_4_ = 0;
    auVar246 = vfmadd231ps_fma(auVar225,local_300,local_300);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar246),local_2e0,local_2e0);
    auVar109 = vrcpps_avx(ZEXT1632(auVar9));
    auVar271._8_4_ = 0x3f800000;
    auVar271._0_8_ = 0x3f8000003f800000;
    auVar271._12_4_ = 0x3f800000;
    auVar271._16_4_ = 0x3f800000;
    auVar271._20_4_ = 0x3f800000;
    auVar271._24_4_ = 0x3f800000;
    auVar271._28_4_ = 0x3f800000;
    auVar246 = vfnmadd213ps_fma(auVar109,ZEXT1632(auVar9),auVar271);
    auVar246 = vfmadd132ps_fma(ZEXT1632(auVar246),auVar109,auVar109);
    local_a40 = vpermps_avx2(_DAT_01fb7720,local_720);
    local_a60 = vpermps_avx2(_DAT_01fb7720,local_740);
    auVar23._4_4_ = fVar129 * local_a40._4_4_;
    auVar23._0_4_ = fVar125 * local_a40._0_4_;
    auVar23._8_4_ = fVar132 * local_a40._8_4_;
    auVar23._12_4_ = fVar169 * local_a40._12_4_;
    auVar23._16_4_ = fVar221 * local_a40._16_4_;
    auVar23._20_4_ = fVar254 * local_a40._20_4_;
    auVar23._24_4_ = fVar255 * local_a40._24_4_;
    auVar23._28_4_ = auVar109._28_4_;
    auVar96 = vfmsub231ps_fma(auVar23,local_a60,local_2e0);
    local_900 = vpermps_avx2(_DAT_01fb7720,local_9a0);
    auVar24._4_4_ = fVar257 * local_900._4_4_;
    auVar24._0_4_ = fVar256 * local_900._0_4_;
    auVar24._8_4_ = fVar259 * local_900._8_4_;
    auVar24._12_4_ = fVar260 * local_900._12_4_;
    auVar24._16_4_ = fVar268 * local_900._16_4_;
    auVar24._20_4_ = fVar275 * local_900._20_4_;
    auVar24._24_4_ = fVar276 * local_900._24_4_;
    auVar24._28_4_ = 0;
    auVar14 = local_a40;
    auVar95 = vfmsub231ps_fma(auVar24,local_a40,local_300);
    auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar95._12_4_ * auVar95._12_4_,
                                                 CONCAT48(auVar95._8_4_ * auVar95._8_4_,
                                                          CONCAT44(auVar95._4_4_ * auVar95._4_4_,
                                                                   auVar95._0_4_ * auVar95._0_4_))))
                              ,ZEXT1632(auVar96),ZEXT1632(auVar96));
    auVar13 = local_a60;
    auVar235._0_4_ = fVar133 * local_a60._0_4_;
    auVar235._4_4_ = fVar147 * local_a60._4_4_;
    auVar235._8_4_ = fVar167 * local_a60._8_4_;
    auVar235._12_4_ = fVar168 * local_a60._12_4_;
    auVar235._16_4_ = fVar243 * local_a60._16_4_;
    auVar235._20_4_ = fVar287 * local_a60._20_4_;
    auVar235._24_4_ = fVar288 * local_a60._24_4_;
    auVar235._28_4_ = 0;
    auVar15 = local_900;
    auVar95 = vfmsub231ps_fma(auVar235,local_900,local_2c0);
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar95),ZEXT1632(auVar95));
    auVar109 = vmaxps_avx(ZEXT1632(CONCAT412(auVar246._12_4_ * auVar8._12_4_,
                                             CONCAT48(auVar246._8_4_ * auVar8._8_4_,
                                                      CONCAT44(auVar246._4_4_ * auVar8._4_4_,
                                                               auVar246._0_4_ * auVar8._0_4_)))),
                          ZEXT1632(CONCAT412(auVar96._12_4_ * auVar246._12_4_,
                                             CONCAT48(auVar96._8_4_ * auVar246._8_4_,
                                                      CONCAT44(auVar96._4_4_ * auVar246._4_4_,
                                                               auVar96._0_4_ * auVar246._0_4_)))));
    local_7a0._0_4_ = fVar170 + auVar274._0_4_;
    local_7a0._4_4_ = fVar187 + auVar274._4_4_;
    local_7a0._8_4_ = fVar205 + auVar274._8_4_;
    local_7a0._12_4_ = fVar206 + auVar274._12_4_;
    local_7a0._16_4_ = fVar258 * 0.0 + 0.0;
    local_7a0._20_4_ = fVar258 * 0.0 + 0.0;
    local_7a0._24_4_ = fVar258 * 0.0 + 0.0;
    local_7a0._28_4_ = fVar258 + 0.0;
    auVar217 = vsubps_avx(ZEXT1632(auVar274),auVar20);
    _local_7c0 = vpermps_avx2(_DAT_01fb7720,auVar217);
    _local_800 = ZEXT1632(auVar274);
    local_7e0 = vpermps_avx2(_DAT_01fb7720,_local_800);
    auVar217 = vmaxps_avx(_local_800,local_7a0);
    auVar6 = vmaxps_avx(_local_7c0,local_7e0);
    auVar217 = vmaxps_avx(auVar217,auVar6);
    auVar6 = vrsqrtps_avx(ZEXT1632(auVar9));
    fVar170 = auVar6._0_4_;
    fVar187 = auVar6._4_4_;
    fVar205 = auVar6._8_4_;
    fVar206 = auVar6._12_4_;
    fVar207 = auVar6._16_4_;
    fVar219 = auVar6._20_4_;
    fVar220 = auVar6._24_4_;
    auVar264._0_4_ = fVar170 * fVar170 * fVar170 * auVar9._0_4_ * -0.5;
    auVar264._4_4_ = fVar187 * fVar187 * fVar187 * auVar9._4_4_ * -0.5;
    auVar264._8_4_ = fVar205 * fVar205 * fVar205 * auVar9._8_4_ * -0.5;
    auVar264._12_4_ = fVar206 * fVar206 * fVar206 * auVar9._12_4_ * -0.5;
    auVar264._16_4_ = fVar207 * fVar207 * fVar207 * -0.0;
    auVar264._20_4_ = fVar219 * fVar219 * fVar219 * -0.0;
    auVar264._24_4_ = fVar220 * fVar220 * fVar220 * -0.0;
    auVar264._28_4_ = 0;
    auVar198._8_4_ = 0x3fc00000;
    auVar198._0_8_ = 0x3fc000003fc00000;
    auVar198._12_4_ = 0x3fc00000;
    auVar198._16_4_ = 0x3fc00000;
    auVar198._20_4_ = 0x3fc00000;
    auVar198._24_4_ = 0x3fc00000;
    auVar198._28_4_ = 0x3fc00000;
    auVar246 = vfmadd231ps_fma(auVar264,auVar198,auVar6);
    auVar267 = ZEXT1664(auVar246);
    fVar187 = auVar246._0_4_;
    fVar205 = auVar246._4_4_;
    auVar25._4_4_ = fVar147 * fVar205;
    auVar25._0_4_ = fVar133 * fVar187;
    fVar207 = auVar246._8_4_;
    auVar25._8_4_ = fVar167 * fVar207;
    fVar220 = auVar246._12_4_;
    auVar25._12_4_ = fVar168 * fVar220;
    auVar25._16_4_ = fVar243 * 0.0;
    auVar25._20_4_ = fVar287 * 0.0;
    auVar25._24_4_ = fVar288 * 0.0;
    auVar25._28_4_ = auVar6._28_4_;
    auVar26._4_4_ = fStack_6bc * fVar129 * fVar205;
    auVar26._0_4_ = local_6c0 * fVar125 * fVar187;
    auVar26._8_4_ = fStack_6b8 * fVar132 * fVar207;
    auVar26._12_4_ = fStack_6b4 * fVar169 * fVar220;
    auVar26._16_4_ = fStack_6b0 * fVar221 * 0.0;
    auVar26._20_4_ = fStack_6ac * fVar254 * 0.0;
    auVar26._24_4_ = fStack_6a8 * fVar255 * 0.0;
    auVar26._28_4_ = local_2c0._28_4_;
    auVar246 = vfmadd231ps_fma(auVar26,auVar25,_local_6a0);
    local_280 = ZEXT1632(auVar100);
    auVar199 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar6 = vsubps_avx(auVar199,local_280);
    fVar133 = auVar6._0_4_;
    fVar147 = auVar6._4_4_;
    auVar27._4_4_ = fVar147 * fVar129 * fVar205;
    auVar27._0_4_ = fVar133 * fVar125 * fVar187;
    fVar167 = auVar6._8_4_;
    auVar27._8_4_ = fVar167 * fVar132 * fVar207;
    fVar168 = auVar6._12_4_;
    auVar27._12_4_ = fVar168 * fVar169 * fVar220;
    fVar169 = auVar6._16_4_;
    auVar27._16_4_ = fVar169 * fVar221 * 0.0;
    fVar243 = auVar6._20_4_;
    auVar27._20_4_ = fVar243 * fVar254 * 0.0;
    fVar254 = auVar6._24_4_;
    auVar27._24_4_ = fVar254 * fVar255 * 0.0;
    auVar27._28_4_ = local_300._28_4_;
    local_2a0 = ZEXT1632(auVar7);
    auVar199 = vsubps_avx(auVar199,local_2a0);
    auVar233 = ZEXT3264(auVar199);
    auVar7 = vfmadd231ps_fma(auVar27,auVar199,auVar25);
    auVar28._4_4_ = fVar257 * fVar205;
    auVar28._0_4_ = fVar256 * fVar187;
    auVar28._8_4_ = fVar259 * fVar207;
    auVar28._12_4_ = fVar260 * fVar220;
    auVar28._16_4_ = fVar268 * 0.0;
    auVar28._20_4_ = fVar275 * 0.0;
    uVar90 = local_7c0._28_4_;
    auVar28._24_4_ = fVar276 * 0.0;
    auVar28._28_4_ = uVar90;
    auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar28,_local_600);
    auVar270 = ZEXT1664(auVar246);
    auVar200 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar116 = vsubps_avx(auVar200,auVar111);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar116,auVar28);
    local_8e0 = vsqrtps_avx(auVar109);
    auVar29._4_4_ = fStack_6bc * fVar147;
    auVar29._0_4_ = local_6c0 * fVar133;
    auVar29._8_4_ = fStack_6b8 * fVar167;
    auVar29._12_4_ = fStack_6b4 * fVar168;
    auVar29._16_4_ = fStack_6b0 * fVar169;
    auVar29._20_4_ = fStack_6ac * fVar243;
    auVar29._24_4_ = fStack_6a8 * fVar254;
    auVar29._28_4_ = auVar109._28_4_;
    auVar100 = vfmadd231ps_fma(auVar29,_local_6a0,auVar199);
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),_local_600,auVar116);
    fVar170 = auVar7._0_4_;
    fVar255 = auVar246._0_4_;
    fVar206 = auVar7._4_4_;
    fVar256 = auVar246._4_4_;
    fVar219 = auVar7._8_4_;
    fVar257 = auVar246._8_4_;
    fVar221 = auVar7._12_4_;
    fVar259 = auVar246._12_4_;
    auVar30._28_4_ = uVar90;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(fVar259 * fVar221,
                            CONCAT48(fVar257 * fVar219,CONCAT44(fVar256 * fVar206,fVar255 * fVar170)
                                    )));
    auVar109 = vsubps_avx(ZEXT1632(auVar100),auVar30);
    auVar31._4_4_ = fVar147 * fVar147;
    auVar31._0_4_ = fVar133 * fVar133;
    auVar31._8_4_ = fVar167 * fVar167;
    auVar31._12_4_ = fVar168 * fVar168;
    auVar31._16_4_ = fVar169 * fVar169;
    auVar31._20_4_ = fVar243 * fVar243;
    auVar31._24_4_ = fVar254 * fVar254;
    auVar31._28_4_ = uVar90;
    auVar100 = vfmadd231ps_fma(auVar31,auVar199,auVar199);
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar116,auVar116);
    auVar32._28_4_ = local_2e0._28_4_;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(fVar221 * fVar221,
                            CONCAT48(fVar219 * fVar219,CONCAT44(fVar206 * fVar206,fVar170 * fVar170)
                                    )));
    local_620 = vsubps_avx(ZEXT1632(auVar100),auVar32);
    fVar132 = auVar217._28_4_ + local_8e0._28_4_;
    fVar170 = (auVar217._0_4_ + local_8e0._0_4_) * 1.0000002;
    fVar206 = (auVar217._4_4_ + local_8e0._4_4_) * 1.0000002;
    fVar219 = (auVar217._8_4_ + local_8e0._8_4_) * 1.0000002;
    fVar221 = (auVar217._12_4_ + local_8e0._12_4_) * 1.0000002;
    fVar258 = (auVar217._16_4_ + local_8e0._16_4_) * 1.0000002;
    fVar125 = (auVar217._20_4_ + local_8e0._20_4_) * 1.0000002;
    fVar129 = (auVar217._24_4_ + local_8e0._24_4_) * 1.0000002;
    auVar33._4_4_ = fVar206 * fVar206;
    auVar33._0_4_ = fVar170 * fVar170;
    auVar33._8_4_ = fVar219 * fVar219;
    auVar33._12_4_ = fVar221 * fVar221;
    auVar33._16_4_ = fVar258 * fVar258;
    auVar33._20_4_ = fVar125 * fVar125;
    auVar33._24_4_ = fVar129 * fVar129;
    auVar33._28_4_ = fVar132;
    local_380._0_4_ = auVar109._0_4_ + auVar109._0_4_;
    local_380._4_4_ = auVar109._4_4_ + auVar109._4_4_;
    local_380._8_4_ = auVar109._8_4_ + auVar109._8_4_;
    local_380._12_4_ = auVar109._12_4_ + auVar109._12_4_;
    local_380._16_4_ = auVar109._16_4_ + auVar109._16_4_;
    local_380._20_4_ = auVar109._20_4_ + auVar109._20_4_;
    local_380._24_4_ = auVar109._24_4_ + auVar109._24_4_;
    fVar170 = auVar109._28_4_;
    local_380._28_4_ = fVar170 + fVar170;
    auVar217 = vsubps_avx(local_620,auVar33);
    auVar159 = ZEXT1632(auVar246);
    local_8a0._28_4_ = fVar132;
    local_8a0._0_28_ =
         ZEXT1628(CONCAT412(fVar259 * fVar259,
                            CONCAT48(fVar257 * fVar257,CONCAT44(fVar256 * fVar256,fVar255 * fVar255)
                                    )));
    local_9c0 = vsubps_avx(local_240,local_8a0);
    local_640._4_4_ = local_380._4_4_ * local_380._4_4_;
    local_640._0_4_ = local_380._0_4_ * local_380._0_4_;
    local_640._8_4_ = local_380._8_4_ * local_380._8_4_;
    local_640._12_4_ = local_380._12_4_ * local_380._12_4_;
    local_640._16_4_ = local_380._16_4_ * local_380._16_4_;
    local_640._20_4_ = local_380._20_4_ * local_380._20_4_;
    local_640._24_4_ = local_380._24_4_ * local_380._24_4_;
    local_640._28_4_ = local_6a0._28_4_;
    fVar206 = local_9c0._0_4_;
    local_660._0_4_ = fVar206 * 4.0;
    fVar219 = local_9c0._4_4_;
    local_660._4_4_ = fVar219 * 4.0;
    fVar221 = local_9c0._8_4_;
    fStack_658 = fVar221 * 4.0;
    fVar258 = local_9c0._12_4_;
    fStack_654 = fVar258 * 4.0;
    fVar125 = local_9c0._16_4_;
    fStack_650 = fVar125 * 4.0;
    fVar129 = local_9c0._20_4_;
    fStack_64c = fVar129 * 4.0;
    fVar132 = local_9c0._24_4_;
    fStack_648 = fVar132 * 4.0;
    uStack_644 = 0x40800000;
    auVar34._4_4_ = auVar217._4_4_ * (float)local_660._4_4_;
    auVar34._0_4_ = auVar217._0_4_ * (float)local_660._0_4_;
    auVar34._8_4_ = auVar217._8_4_ * fStack_658;
    auVar34._12_4_ = auVar217._12_4_ * fStack_654;
    auVar34._16_4_ = auVar217._16_4_ * fStack_650;
    auVar34._20_4_ = auVar217._20_4_ * fStack_64c;
    auVar34._24_4_ = auVar217._24_4_ * fStack_648;
    auVar34._28_4_ = fVar170;
    auVar141 = vsubps_avx(local_640,auVar34);
    auVar109 = vcmpps_avx(auVar141,auVar200,5);
    local_8c0._0_4_ = fVar206 + fVar206;
    local_8c0._4_4_ = fVar219 + fVar219;
    local_8c0._8_4_ = fVar221 + fVar221;
    local_8c0._12_4_ = fVar258 + fVar258;
    local_8c0._16_4_ = fVar125 + fVar125;
    local_8c0._20_4_ = fVar129 + fVar129;
    local_8c0._24_4_ = fVar132 + fVar132;
    local_8c0._28_4_ = local_9c0._28_4_ + local_9c0._28_4_;
    auVar285 = ZEXT1632(auVar7);
    if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar109 >> 0x7f,0) == '\0') &&
          (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar109 >> 0xbf,0) == '\0') &&
        (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar109[0x1f])
    {
      auVar201._8_4_ = 0x7f800000;
      auVar201._0_8_ = 0x7f8000007f800000;
      auVar201._12_4_ = 0x7f800000;
      auVar201._16_4_ = 0x7f800000;
      auVar201._20_4_ = 0x7f800000;
      auVar201._24_4_ = 0x7f800000;
      auVar201._28_4_ = 0x7f800000;
      auVar279._8_4_ = 0xff800000;
      auVar279._0_8_ = 0xff800000ff800000;
      auVar279._12_4_ = 0xff800000;
      auVar279._16_4_ = 0xff800000;
      auVar279._20_4_ = 0xff800000;
      auVar279._24_4_ = 0xff800000;
      auVar279._28_4_ = 0xff800000;
    }
    else {
      local_960 = auVar109;
      auVar10 = vsqrtps_avx(auVar141);
      auVar200 = vcmpps_avx(auVar141,auVar200,5);
      auVar141 = vrcpps_avx(local_8c0);
      auVar140._8_4_ = 0x3f800000;
      auVar140._0_8_ = 0x3f8000003f800000;
      auVar140._12_4_ = 0x3f800000;
      auVar140._16_4_ = 0x3f800000;
      auVar140._20_4_ = 0x3f800000;
      auVar140._24_4_ = 0x3f800000;
      auVar140._28_4_ = 0x3f800000;
      auVar246 = vfnmadd213ps_fma(auVar141,local_8c0,auVar140);
      auVar246 = vfmadd132ps_fma(ZEXT1632(auVar246),auVar141,auVar141);
      uVar12 = CONCAT44(local_380._4_4_,local_380._0_4_);
      auVar202._0_8_ = uVar12 ^ 0x8000000080000000;
      auVar202._8_4_ = -local_380._8_4_;
      auVar202._12_4_ = -local_380._12_4_;
      auVar202._16_4_ = -local_380._16_4_;
      auVar202._20_4_ = -local_380._20_4_;
      auVar202._24_4_ = -local_380._24_4_;
      auVar202._28_4_ = -local_380._28_4_;
      auVar141 = vsubps_avx(auVar202,auVar10);
      auVar35._4_4_ = auVar246._4_4_ * auVar141._4_4_;
      auVar35._0_4_ = auVar246._0_4_ * auVar141._0_4_;
      auVar35._8_4_ = auVar246._8_4_ * auVar141._8_4_;
      auVar35._12_4_ = auVar246._12_4_ * auVar141._12_4_;
      auVar35._16_4_ = auVar141._16_4_ * 0.0;
      auVar35._20_4_ = auVar141._20_4_ * 0.0;
      auVar35._24_4_ = auVar141._24_4_ * 0.0;
      auVar35._28_4_ = auVar141._28_4_;
      auVar141 = vsubps_avx(auVar10,local_380);
      auVar280._0_4_ = auVar141._0_4_ * auVar246._0_4_;
      auVar280._4_4_ = auVar141._4_4_ * auVar246._4_4_;
      auVar280._8_4_ = auVar141._8_4_ * auVar246._8_4_;
      auVar280._12_4_ = auVar141._12_4_ * auVar246._12_4_;
      auVar280._16_4_ = auVar141._16_4_ * 0.0;
      auVar280._20_4_ = auVar141._20_4_ * 0.0;
      auVar280._24_4_ = auVar141._24_4_ * 0.0;
      auVar280._28_4_ = 0;
      auVar246 = vfmadd213ps_fma(auVar159,auVar35,auVar285);
      local_340 = ZEXT1632(CONCAT412(fVar220 * auVar246._12_4_,
                                     CONCAT48(fVar207 * auVar246._8_4_,
                                              CONCAT44(fVar205 * auVar246._4_4_,
                                                       fVar187 * auVar246._0_4_))));
      auVar141 = vandps_avx(local_700,local_8a0);
      auVar141 = vmaxps_avx(local_540,auVar141);
      auVar36._4_4_ = auVar141._4_4_ * 1.9073486e-06;
      auVar36._0_4_ = auVar141._0_4_ * 1.9073486e-06;
      auVar36._8_4_ = auVar141._8_4_ * 1.9073486e-06;
      auVar36._12_4_ = auVar141._12_4_ * 1.9073486e-06;
      auVar36._16_4_ = auVar141._16_4_ * 1.9073486e-06;
      auVar36._20_4_ = auVar141._20_4_ * 1.9073486e-06;
      auVar36._24_4_ = auVar141._24_4_ * 1.9073486e-06;
      auVar36._28_4_ = auVar141._28_4_;
      auVar141 = vandps_avx(local_700,local_9c0);
      auVar141 = vcmpps_avx(auVar141,auVar36,1);
      auVar246 = vfmadd213ps_fma(auVar159,auVar280,auVar285);
      auVar112._8_4_ = 0x7f800000;
      auVar112._0_8_ = 0x7f8000007f800000;
      auVar112._12_4_ = 0x7f800000;
      auVar112._16_4_ = 0x7f800000;
      auVar112._20_4_ = 0x7f800000;
      auVar112._24_4_ = 0x7f800000;
      auVar112._28_4_ = 0x7f800000;
      auVar201 = vblendvps_avx(auVar112,auVar35,auVar200);
      local_360 = fVar187 * auVar246._0_4_;
      fStack_35c = fVar205 * auVar246._4_4_;
      fStack_358 = fVar207 * auVar246._8_4_;
      fStack_354 = fVar220 * auVar246._12_4_;
      uStack_350 = 0;
      uStack_34c = 0;
      uStack_348 = 0;
      uStack_344 = 0x7f800000;
      auVar272._8_4_ = 0xff800000;
      auVar272._0_8_ = 0xff800000ff800000;
      auVar272._12_4_ = 0xff800000;
      auVar272._16_4_ = 0xff800000;
      auVar272._20_4_ = 0xff800000;
      auVar272._24_4_ = 0xff800000;
      auVar272._28_4_ = 0xff800000;
      auVar279 = vblendvps_avx(auVar272,auVar280,auVar200);
      auVar10 = auVar200 & auVar141;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar109 = vandps_avx(auVar141,auVar200);
        auVar141 = vcmpps_avx(auVar217,_DAT_01f7b000,2);
        auVar123._8_4_ = 0x7f800000;
        auVar123._0_8_ = 0x7f8000007f800000;
        auVar123._12_4_ = 0x7f800000;
        auVar123._16_4_ = 0x7f800000;
        auVar123._20_4_ = 0x7f800000;
        auVar123._24_4_ = 0x7f800000;
        auVar123._28_4_ = 0x7f800000;
        auVar283._8_4_ = 0xff800000;
        auVar283._0_8_ = 0xff800000ff800000;
        auVar283._12_4_ = 0xff800000;
        auVar283._16_4_ = 0xff800000;
        auVar283._20_4_ = 0xff800000;
        auVar283._24_4_ = 0xff800000;
        auVar283._28_4_ = 0xff800000;
        auVar217 = vblendvps_avx(auVar123,auVar283,auVar141);
        auVar246 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
        auVar10 = vpmovsxwd_avx2(auVar246);
        auVar201 = vblendvps_avx(auVar201,auVar217,auVar10);
        auVar124._8_4_ = 0xff800000;
        auVar124._0_8_ = 0xff800000ff800000;
        auVar124._12_4_ = 0xff800000;
        auVar124._16_4_ = 0xff800000;
        auVar124._20_4_ = 0xff800000;
        auVar124._24_4_ = 0xff800000;
        auVar124._28_4_ = 0xff800000;
        auVar284._8_4_ = 0x7f800000;
        auVar284._0_8_ = 0x7f8000007f800000;
        auVar284._12_4_ = 0x7f800000;
        auVar284._16_4_ = 0x7f800000;
        auVar284._20_4_ = 0x7f800000;
        auVar284._24_4_ = 0x7f800000;
        auVar284._28_4_ = 0x7f800000;
        auVar217 = vblendvps_avx(auVar124,auVar284,auVar141);
        auVar279 = vblendvps_avx(auVar279,auVar217,auVar10);
        auVar252._0_8_ = auVar109._0_8_ ^ 0xffffffffffffffff;
        auVar252._8_4_ = auVar109._8_4_ ^ 0xffffffff;
        auVar252._12_4_ = auVar109._12_4_ ^ 0xffffffff;
        auVar252._16_4_ = auVar109._16_4_ ^ 0xffffffff;
        auVar252._20_4_ = auVar109._20_4_ ^ 0xffffffff;
        auVar252._24_4_ = auVar109._24_4_ ^ 0xffffffff;
        auVar252._28_4_ = auVar109._28_4_ ^ 0xffffffff;
        auVar109 = vorps_avx(auVar141,auVar252);
        auVar109 = vandps_avx(auVar200,auVar109);
      }
    }
    auVar273 = ZEXT3264(local_8c0);
    auVar253 = ZEXT3264(local_8a0);
    auVar217 = local_320 & auVar109;
    fVar170 = (float)local_820._0_4_;
    fVar206 = (float)local_820._4_4_;
    fVar219 = fStack_818;
    fVar221 = fStack_814;
    fVar258 = fStack_810;
    fVar125 = fStack_80c;
    fVar129 = fStack_808;
    fVar132 = fStack_804;
    if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar217 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar217 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar217 >> 0x7f,0) != '\0') ||
          (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar217 >> 0xbf,0) != '\0') ||
        (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar217[0x1f] < '\0') {
      fVar255 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_840._0_4_;
      auVar236._4_4_ = fVar255;
      auVar236._0_4_ = fVar255;
      auVar236._8_4_ = fVar255;
      auVar236._12_4_ = fVar255;
      auVar236._16_4_ = fVar255;
      auVar236._20_4_ = fVar255;
      auVar236._24_4_ = fVar255;
      auVar236._28_4_ = fVar255;
      auVar141 = vmaxps_avx(auVar236,auVar201);
      fVar255 = (ray->super_RayK<1>).tfar - (float)local_840._0_4_;
      auVar237._4_4_ = fVar255;
      auVar237._0_4_ = fVar255;
      auVar237._8_4_ = fVar255;
      auVar237._12_4_ = fVar255;
      auVar237._16_4_ = fVar255;
      auVar237._20_4_ = fVar255;
      auVar237._24_4_ = fVar255;
      auVar237._28_4_ = fVar255;
      auVar200 = vminps_avx(auVar237,auVar279);
      auVar37._4_4_ = fVar126 * fVar147;
      auVar37._0_4_ = fVar89 * fVar133;
      auVar37._8_4_ = fVar128 * fVar167;
      auVar37._12_4_ = fVar130 * fVar168;
      auVar37._16_4_ = fVar88 * fVar169;
      auVar37._20_4_ = fVar127 * fVar243;
      auVar37._24_4_ = fVar131 * fVar254;
      auVar37._28_4_ = auVar6._28_4_;
      local_960 = auVar109;
      auVar246 = vfmadd213ps_fma(auVar199,local_9a0,auVar37);
      auVar7 = vfmadd213ps_fma(auVar116,local_720,ZEXT1632(auVar246));
      auVar38._4_4_ = fVar126 * fStack_6bc;
      auVar38._0_4_ = fVar89 * local_6c0;
      auVar38._8_4_ = fVar128 * fStack_6b8;
      auVar38._12_4_ = fVar130 * fStack_6b4;
      auVar38._16_4_ = fVar88 * fStack_6b0;
      auVar38._20_4_ = fVar127 * fStack_6ac;
      auVar38._24_4_ = fVar131 * fStack_6a8;
      auVar38._28_4_ = auVar6._28_4_;
      auVar246 = vfmadd231ps_fma(auVar38,local_9a0,_local_6a0);
      auVar100 = vfmadd231ps_fma(ZEXT1632(auVar246),_local_600,local_720);
      auVar217 = vandps_avx(ZEXT1632(auVar100),local_700);
      auVar113._8_4_ = 0x219392ef;
      auVar113._0_8_ = 0x219392ef219392ef;
      auVar113._12_4_ = 0x219392ef;
      auVar113._16_4_ = 0x219392ef;
      auVar113._20_4_ = 0x219392ef;
      auVar113._24_4_ = 0x219392ef;
      auVar113._28_4_ = 0x219392ef;
      auVar6 = vcmpps_avx(auVar217,auVar113,1);
      auVar217 = vrcpps_avx(ZEXT1632(auVar100));
      auVar92._8_4_ = 0x3f800000;
      auVar92._0_8_ = 0x3f8000003f800000;
      auVar114._12_4_ = 0x3f800000;
      auVar114._0_12_ = auVar92;
      auVar114._16_4_ = 0x3f800000;
      auVar114._20_4_ = 0x3f800000;
      auVar114._24_4_ = 0x3f800000;
      auVar114._28_4_ = 0x3f800000;
      auVar116 = ZEXT1632(auVar100);
      auVar246 = vfnmadd213ps_fma(auVar217,auVar116,auVar114);
      auVar246 = vfmadd132ps_fma(ZEXT1632(auVar246),auVar217,auVar217);
      auVar249._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
      auVar249._8_4_ = auVar100._8_4_ ^ 0x80000000;
      auVar249._12_4_ = auVar100._12_4_ ^ 0x80000000;
      auVar249._16_4_ = 0x80000000;
      auVar249._20_4_ = 0x80000000;
      auVar249._24_4_ = 0x80000000;
      auVar249._28_4_ = 0x80000000;
      auVar39._4_4_ = auVar246._4_4_ * -auVar7._4_4_;
      auVar39._0_4_ = auVar246._0_4_ * -auVar7._0_4_;
      auVar39._8_4_ = auVar246._8_4_ * -auVar7._8_4_;
      auVar39._12_4_ = auVar246._12_4_ * -auVar7._12_4_;
      auVar39._16_4_ = 0x80000000;
      auVar39._20_4_ = 0x80000000;
      auVar39._24_4_ = 0x80000000;
      auVar39._28_4_ = 0x80000000;
      auVar217 = vcmpps_avx(auVar116,auVar249,1);
      auVar217 = vorps_avx(auVar217,auVar6);
      auVar281._8_4_ = 0xff800000;
      auVar281._0_8_ = 0xff800000ff800000;
      auVar281._12_4_ = 0xff800000;
      auVar281._16_4_ = 0xff800000;
      auVar281._20_4_ = 0xff800000;
      auVar281._24_4_ = 0xff800000;
      auVar281._28_4_ = 0xff800000;
      auVar217 = vblendvps_avx(auVar39,auVar281,auVar217);
      auVar199 = vmaxps_avx(auVar141,auVar217);
      auVar217 = vcmpps_avx(auVar116,auVar249,6);
      auVar217 = vorps_avx(auVar6,auVar217);
      auVar282._8_4_ = 0x7f800000;
      auVar282._0_8_ = 0x7f8000007f800000;
      auVar282._12_4_ = 0x7f800000;
      auVar282._16_4_ = 0x7f800000;
      auVar282._20_4_ = 0x7f800000;
      auVar282._24_4_ = 0x7f800000;
      auVar282._28_4_ = 0x7f800000;
      auVar217 = vblendvps_avx(auVar39,auVar282,auVar217);
      auVar116 = vminps_avx(auVar200,auVar217);
      fVar89 = -local_a60._0_4_;
      fVar126 = -local_a60._4_4_;
      fVar128 = -local_a60._8_4_;
      fVar130 = -local_a60._12_4_;
      fVar88 = -local_a60._16_4_;
      fVar127 = -local_a60._20_4_;
      fVar131 = -local_a60._24_4_;
      auVar231._0_8_ = local_900._0_8_ ^ 0x8000000080000000;
      auVar231._8_4_ = -local_900._8_4_;
      auVar231._12_4_ = -local_900._12_4_;
      auVar231._16_4_ = -local_900._16_4_;
      auVar231._20_4_ = -local_900._20_4_;
      auVar231._24_4_ = -local_900._24_4_;
      auVar231._28_4_ = local_900._28_4_ ^ 0x80000000;
      auVar217 = vsubps_avx(ZEXT832(0) << 0x20,local_980);
      auVar6 = vsubps_avx(ZEXT832(0) << 0x20,_local_880);
      auVar40._4_4_ = auVar6._4_4_ * fVar126;
      auVar40._0_4_ = auVar6._0_4_ * fVar89;
      auVar40._8_4_ = auVar6._8_4_ * fVar128;
      auVar40._12_4_ = auVar6._12_4_ * fVar130;
      auVar40._16_4_ = auVar6._16_4_ * fVar88;
      auVar40._20_4_ = auVar6._20_4_ * fVar127;
      auVar40._24_4_ = auVar6._24_4_ * fVar131;
      auVar40._28_4_ = auVar6._28_4_;
      auVar246 = vfmadd231ps_fma(auVar40,auVar231,auVar217);
      auVar238._0_8_ = local_a40._0_8_ ^ 0x8000000080000000;
      auVar238._8_4_ = -local_a40._8_4_;
      auVar238._12_4_ = -local_a40._12_4_;
      auVar238._16_4_ = -local_a40._16_4_;
      auVar238._20_4_ = -local_a40._20_4_;
      auVar238._24_4_ = -local_a40._24_4_;
      auVar238._28_4_ = local_a40._28_4_ ^ 0x80000000;
      auVar217 = vsubps_avx(ZEXT832(0) << 0x20,local_860);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar238,auVar217);
      auVar41._4_4_ = fVar126 * fStack_6bc;
      auVar41._0_4_ = fVar89 * local_6c0;
      auVar41._8_4_ = fVar128 * fStack_6b8;
      auVar41._12_4_ = fVar130 * fStack_6b4;
      auVar41._16_4_ = fVar88 * fStack_6b0;
      auVar41._20_4_ = fVar127 * fStack_6ac;
      auVar41._24_4_ = fVar131 * fStack_6a8;
      auVar41._28_4_ = local_a60._28_4_ ^ 0x80000000;
      auVar246 = vfmadd231ps_fma(auVar41,auVar231,_local_6a0);
      auVar100 = vfmadd231ps_fma(ZEXT1632(auVar246),_local_600,auVar238);
      auVar217 = vandps_avx(ZEXT1632(auVar100),local_700);
      auVar141 = vrcpps_avx(ZEXT1632(auVar100));
      auVar158._8_4_ = 0x219392ef;
      auVar158._0_8_ = 0x219392ef219392ef;
      auVar158._12_4_ = 0x219392ef;
      auVar158._16_4_ = 0x219392ef;
      auVar158._20_4_ = 0x219392ef;
      auVar158._24_4_ = 0x219392ef;
      auVar158._28_4_ = 0x219392ef;
      auVar6 = vcmpps_avx(auVar217,auVar158,1);
      auVar233 = ZEXT3264(auVar6);
      auVar200 = ZEXT1632(auVar100);
      auVar246 = vfnmadd213ps_fma(auVar141,auVar200,auVar114);
      auVar246 = vfmadd132ps_fma(ZEXT1632(auVar246),auVar141,auVar141);
      auVar239._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
      auVar239._8_4_ = auVar100._8_4_ ^ 0x80000000;
      auVar239._12_4_ = auVar100._12_4_ ^ 0x80000000;
      auVar239._16_4_ = 0x80000000;
      auVar239._20_4_ = 0x80000000;
      auVar239._24_4_ = 0x80000000;
      auVar239._28_4_ = 0x80000000;
      auVar42._4_4_ = auVar246._4_4_ * -auVar7._4_4_;
      auVar42._0_4_ = auVar246._0_4_ * -auVar7._0_4_;
      auVar42._8_4_ = auVar246._8_4_ * -auVar7._8_4_;
      auVar42._12_4_ = auVar246._12_4_ * -auVar7._12_4_;
      auVar42._16_4_ = 0x80000000;
      auVar42._20_4_ = 0x80000000;
      auVar42._24_4_ = 0x80000000;
      auVar42._28_4_ = 0x80000000;
      auVar253 = ZEXT3264(auVar42);
      auVar217 = vcmpps_avx(auVar200,auVar239,1);
      auVar217 = vorps_avx(auVar217,auVar6);
      auVar115._8_4_ = 0xff800000;
      auVar115._0_8_ = 0xff800000ff800000;
      auVar115._12_4_ = 0xff800000;
      auVar115._16_4_ = 0xff800000;
      auVar115._20_4_ = 0xff800000;
      auVar115._24_4_ = 0xff800000;
      auVar115._28_4_ = 0xff800000;
      auVar217 = vblendvps_avx(auVar42,auVar115,auVar217);
      auVar273 = ZEXT3264(auVar217);
      local_6e0 = vmaxps_avx(auVar199,auVar217);
      auVar217 = vcmpps_avx(auVar200,auVar239,6);
      auVar217 = vorps_avx(auVar6,auVar217);
      auVar217 = vblendvps_avx(auVar42,auVar282,auVar217);
      auVar109 = vandps_avx(local_320,auVar109);
      local_5a0 = vminps_avx(auVar116,auVar217);
      auVar217 = vcmpps_avx(local_6e0,local_5a0,2);
      auVar6 = auVar109 & auVar217;
      if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar6 >> 0x7f,0) != '\0') ||
            (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar6 >> 0xbf,0) != '\0') ||
          (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar6[0x1f] < '\0')
      {
        auVar6 = vminps_avx(local_340,auVar114);
        auVar273 = ZEXT864(0) << 0x20;
        auVar6 = vmaxps_avx(auVar6,ZEXT832(0) << 0x20);
        auVar72._4_4_ = fStack_35c;
        auVar72._0_4_ = local_360;
        auVar72._8_4_ = fStack_358;
        auVar72._12_4_ = fStack_354;
        auVar72._16_4_ = uStack_350;
        auVar72._20_4_ = uStack_34c;
        auVar72._24_4_ = uStack_348;
        auVar72._28_4_ = uStack_344;
        auVar199 = vminps_avx(auVar72,auVar114);
        auVar199 = vmaxps_avx(auVar199,ZEXT832(0) << 0x20);
        auVar43._4_4_ = (auVar6._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar6._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar6._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar6._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar6._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar6._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar6._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar6._28_4_ + 7.0;
        auVar246 = vfmadd213ps_fma(auVar43,local_780,local_760);
        auVar44._4_4_ = (auVar199._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar199._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar199._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar199._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar199._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar199._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar199._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar199._28_4_ + 7.0;
        auVar7 = vfmadd213ps_fma(auVar44,local_780,local_760);
        auVar6 = vminps_avx(_local_800,local_7a0);
        auVar199 = vminps_avx(_local_7c0,local_7e0);
        auVar6 = vminps_avx(auVar6,auVar199);
        auVar6 = vsubps_avx(auVar6,local_8e0);
        auVar109 = vandps_avx(auVar217,auVar109);
        local_1a0 = ZEXT1632(auVar246);
        local_1c0 = ZEXT1632(auVar7);
        auVar45._4_4_ = auVar6._4_4_ * 0.99999976;
        auVar45._0_4_ = auVar6._0_4_ * 0.99999976;
        auVar45._8_4_ = auVar6._8_4_ * 0.99999976;
        auVar45._12_4_ = auVar6._12_4_ * 0.99999976;
        auVar45._16_4_ = auVar6._16_4_ * 0.99999976;
        auVar45._20_4_ = auVar6._20_4_ * 0.99999976;
        auVar45._24_4_ = auVar6._24_4_ * 0.99999976;
        auVar45._28_4_ = auVar6._28_4_;
        auVar217 = vmaxps_avx(ZEXT832(0) << 0x20,auVar45);
        auVar46._4_4_ = auVar217._4_4_ * auVar217._4_4_;
        auVar46._0_4_ = auVar217._0_4_ * auVar217._0_4_;
        auVar46._8_4_ = auVar217._8_4_ * auVar217._8_4_;
        auVar46._12_4_ = auVar217._12_4_ * auVar217._12_4_;
        auVar46._16_4_ = auVar217._16_4_ * auVar217._16_4_;
        auVar46._20_4_ = auVar217._20_4_ * auVar217._20_4_;
        uVar90 = auVar217._28_4_;
        auVar46._24_4_ = auVar217._24_4_ * auVar217._24_4_;
        auVar46._28_4_ = uVar90;
        auVar217 = vsubps_avx(local_620,auVar46);
        auVar47._4_4_ = auVar217._4_4_ * (float)local_660._4_4_;
        auVar47._0_4_ = auVar217._0_4_ * (float)local_660._0_4_;
        auVar47._8_4_ = auVar217._8_4_ * fStack_658;
        auVar47._12_4_ = auVar217._12_4_ * fStack_654;
        auVar47._16_4_ = auVar217._16_4_ * fStack_650;
        auVar47._20_4_ = auVar217._20_4_ * fStack_64c;
        auVar47._24_4_ = auVar217._24_4_ * fStack_648;
        auVar47._28_4_ = uVar90;
        auVar6 = vsubps_avx(local_640,auVar47);
        local_ac0 = vcmpps_avx(auVar6,ZEXT832(0) << 0x20,5);
        if ((((((((local_ac0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_ac0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_ac0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_ac0 >> 0x7f,0) == '\0') &&
              (local_ac0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_ac0 >> 0xbf,0) == '\0') &&
            (local_ac0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_ac0[0x1f]) {
          auVar159 = ZEXT832(auVar92._4_8_ ^ 0x3f8000003f800000) << 0x20;
          auVar234 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar116 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar141 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar270 = ZEXT864(0) << 0x20;
          auVar250._8_4_ = 0x7f800000;
          auVar250._0_8_ = 0x7f8000007f800000;
          auVar250._12_4_ = 0x7f800000;
          auVar250._16_4_ = 0x7f800000;
          auVar250._20_4_ = 0x7f800000;
          auVar250._24_4_ = 0x7f800000;
          auVar250._28_4_ = 0x7f800000;
          auVar265._8_4_ = 0xff800000;
          auVar265._0_8_ = 0xff800000ff800000;
          auVar265._12_4_ = 0xff800000;
          auVar265._16_4_ = 0xff800000;
          auVar265._20_4_ = 0xff800000;
          auVar265._24_4_ = 0xff800000;
          auVar265._28_4_ = 0xff800000;
        }
        else {
          auVar199 = vrcpps_avx(local_8c0);
          auVar246 = vfnmadd213ps_fma(local_8c0,auVar199,auVar114);
          auVar246 = vfmadd132ps_fma(ZEXT1632(auVar246),auVar199,auVar199);
          auVar199 = vsqrtps_avx(auVar6);
          uVar12 = CONCAT44(local_380._4_4_,local_380._0_4_);
          auVar240._0_8_ = uVar12 ^ 0x8000000080000000;
          auVar240._8_4_ = -local_380._8_4_;
          auVar240._12_4_ = -local_380._12_4_;
          auVar240._16_4_ = -local_380._16_4_;
          auVar240._20_4_ = -local_380._20_4_;
          auVar240._24_4_ = -local_380._24_4_;
          auVar240._28_4_ = -local_380._28_4_;
          auVar116 = vsubps_avx(auVar240,auVar199);
          auVar141 = vsubps_avx(auVar199,local_380);
          fVar133 = auVar116._0_4_ * auVar246._0_4_;
          fVar147 = auVar116._4_4_ * auVar246._4_4_;
          auVar48._4_4_ = fVar147;
          auVar48._0_4_ = fVar133;
          fVar167 = auVar116._8_4_ * auVar246._8_4_;
          auVar48._8_4_ = fVar167;
          fVar168 = auVar116._12_4_ * auVar246._12_4_;
          auVar48._12_4_ = fVar168;
          fVar169 = auVar116._16_4_ * 0.0;
          auVar48._16_4_ = fVar169;
          fVar243 = auVar116._20_4_ * 0.0;
          auVar48._20_4_ = fVar243;
          fVar254 = auVar116._24_4_ * 0.0;
          auVar48._24_4_ = fVar254;
          auVar48._28_4_ = auVar199._28_4_;
          fVar89 = auVar141._0_4_ * auVar246._0_4_;
          fVar126 = auVar141._4_4_ * auVar246._4_4_;
          auVar49._4_4_ = fVar126;
          auVar49._0_4_ = fVar89;
          fVar128 = auVar141._8_4_ * auVar246._8_4_;
          auVar49._8_4_ = fVar128;
          fVar130 = auVar141._12_4_ * auVar246._12_4_;
          auVar49._12_4_ = fVar130;
          fVar88 = auVar141._16_4_ * 0.0;
          auVar49._16_4_ = fVar88;
          fVar127 = auVar141._20_4_ * 0.0;
          auVar49._20_4_ = fVar127;
          fVar131 = auVar141._24_4_ * 0.0;
          auVar49._24_4_ = fVar131;
          auVar49._28_4_ = uVar90;
          auVar246 = vfmadd213ps_fma(auVar159,auVar48,auVar285);
          auVar7 = vfmadd213ps_fma(auVar159,auVar49,auVar285);
          auVar199 = ZEXT1632(CONCAT412(fVar220 * auVar246._12_4_,
                                        CONCAT48(fVar207 * auVar246._8_4_,
                                                 CONCAT44(fVar205 * auVar246._4_4_,
                                                          fVar187 * auVar246._0_4_))));
          auVar50._28_4_ = auVar141._28_4_;
          auVar50._0_28_ =
               ZEXT1628(CONCAT412(fVar220 * auVar7._12_4_,
                                  CONCAT48(fVar207 * auVar7._8_4_,
                                           CONCAT44(fVar205 * auVar7._4_4_,fVar187 * auVar7._0_4_)))
                       );
          auVar246 = vfmadd213ps_fma(local_2e0,auVar199,auVar111);
          auVar7 = vfmadd213ps_fma(local_2e0,auVar50,auVar111);
          auVar100 = vfmadd213ps_fma(local_300,auVar199,local_2a0);
          auVar274 = vfmadd213ps_fma(local_300,auVar50,local_2a0);
          auVar8 = vfmadd213ps_fma(auVar199,local_2c0,local_280);
          auVar9 = vfmadd213ps_fma(local_2c0,auVar50,local_280);
          auVar51._4_4_ = (float)local_600._4_4_ * fVar147;
          auVar51._0_4_ = (float)local_600._0_4_ * fVar133;
          auVar51._8_4_ = fStack_5f8 * fVar167;
          auVar51._12_4_ = fStack_5f4 * fVar168;
          auVar51._16_4_ = fStack_5f0 * fVar169;
          auVar51._20_4_ = fStack_5ec * fVar243;
          auVar51._24_4_ = fStack_5e8 * fVar254;
          auVar51._28_4_ = 0;
          auVar116 = vsubps_avx(auVar51,ZEXT1632(auVar246));
          auVar77._4_4_ = (float)local_6a0._4_4_ * fVar147;
          auVar77._0_4_ = (float)local_6a0._0_4_ * fVar133;
          auVar77._8_4_ = fStack_698 * fVar167;
          auVar77._12_4_ = fStack_694 * fVar168;
          auVar77._16_4_ = fStack_690 * fVar169;
          auVar77._20_4_ = fStack_68c * fVar243;
          auVar77._24_4_ = fStack_688 * fVar254;
          auVar77._28_4_ = 0x80000000;
          auVar141 = vsubps_avx(auVar77,ZEXT1632(auVar100));
          auVar160._0_4_ = local_6c0 * fVar133;
          auVar160._4_4_ = fStack_6bc * fVar147;
          auVar160._8_4_ = fStack_6b8 * fVar167;
          auVar160._12_4_ = fStack_6b4 * fVar168;
          auVar160._16_4_ = fStack_6b0 * fVar169;
          auVar160._20_4_ = fStack_6ac * fVar243;
          auVar160._24_4_ = fStack_6a8 * fVar254;
          auVar160._28_4_ = 0;
          auVar200 = vsubps_avx(auVar160,ZEXT1632(auVar8));
          auVar52._4_4_ = (float)local_600._4_4_ * fVar126;
          auVar52._0_4_ = (float)local_600._0_4_ * fVar89;
          auVar52._8_4_ = fStack_5f8 * fVar128;
          auVar52._12_4_ = fStack_5f4 * fVar130;
          auVar52._16_4_ = fStack_5f0 * fVar88;
          auVar52._20_4_ = fStack_5ec * fVar127;
          auVar52._24_4_ = fStack_5e8 * fVar131;
          auVar52._28_4_ = auVar200._28_4_;
          auVar199 = vsubps_avx(auVar52,ZEXT1632(auVar7));
          auVar273 = ZEXT3264(auVar199);
          auVar53._4_4_ = (float)local_6a0._4_4_ * fVar126;
          auVar53._0_4_ = (float)local_6a0._0_4_ * fVar89;
          auVar53._8_4_ = fStack_698 * fVar128;
          auVar53._12_4_ = fStack_694 * fVar130;
          auVar53._16_4_ = fStack_690 * fVar88;
          auVar53._20_4_ = fStack_68c * fVar127;
          auVar53._24_4_ = fStack_688 * fVar131;
          auVar53._28_4_ = auVar200._28_4_;
          auVar159 = vsubps_avx(auVar53,ZEXT1632(auVar274));
          auVar241._0_4_ = local_6c0 * fVar89;
          auVar241._4_4_ = fStack_6bc * fVar126;
          auVar241._8_4_ = fStack_6b8 * fVar128;
          auVar241._12_4_ = fStack_6b4 * fVar130;
          auVar241._16_4_ = fStack_6b0 * fVar88;
          auVar241._20_4_ = fStack_6ac * fVar127;
          auVar241._24_4_ = fStack_6a8 * fVar131;
          auVar241._28_4_ = 0;
          auVar199 = vsubps_avx(auVar241,ZEXT1632(auVar9));
          auVar234 = auVar199._0_28_;
          auVar199 = vcmpps_avx(auVar6,_DAT_01f7b000,5);
          auVar251._8_4_ = 0x7f800000;
          auVar251._0_8_ = 0x7f8000007f800000;
          auVar251._12_4_ = 0x7f800000;
          auVar251._16_4_ = 0x7f800000;
          auVar251._20_4_ = 0x7f800000;
          auVar251._24_4_ = 0x7f800000;
          auVar251._28_4_ = 0x7f800000;
          auVar250 = vblendvps_avx(auVar251,auVar48,auVar199);
          auVar6 = vandps_avx(local_700,local_8a0);
          auVar6 = vmaxps_avx(local_540,auVar6);
          auVar54._4_4_ = auVar6._4_4_ * 1.9073486e-06;
          auVar54._0_4_ = auVar6._0_4_ * 1.9073486e-06;
          auVar54._8_4_ = auVar6._8_4_ * 1.9073486e-06;
          auVar54._12_4_ = auVar6._12_4_ * 1.9073486e-06;
          auVar54._16_4_ = auVar6._16_4_ * 1.9073486e-06;
          auVar54._20_4_ = auVar6._20_4_ * 1.9073486e-06;
          auVar54._24_4_ = auVar6._24_4_ * 1.9073486e-06;
          auVar54._28_4_ = auVar6._28_4_;
          auVar6 = vandps_avx(local_700,local_9c0);
          auVar6 = vcmpps_avx(auVar6,auVar54,1);
          auVar266._8_4_ = 0xff800000;
          auVar266._0_8_ = 0xff800000ff800000;
          auVar266._12_4_ = 0xff800000;
          auVar266._16_4_ = 0xff800000;
          auVar266._20_4_ = 0xff800000;
          auVar266._24_4_ = 0xff800000;
          auVar266._28_4_ = 0xff800000;
          auVar265 = vblendvps_avx(auVar266,auVar49,auVar199);
          auVar285 = auVar199 & auVar6;
          if ((((((((auVar285 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar285 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar285 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar285 >> 0x7f,0) != '\0') ||
                (auVar285 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar285 >> 0xbf,0) != '\0') ||
              (auVar285 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar285[0x1f] < '\0') {
            auVar6 = vandps_avx(auVar199,auVar6);
            auVar285 = vcmpps_avx(auVar217,ZEXT832(0) << 0x20,2);
            auVar269._8_4_ = 0xff800000;
            auVar269._0_8_ = 0xff800000ff800000;
            auVar269._12_4_ = 0xff800000;
            auVar269._16_4_ = 0xff800000;
            auVar269._20_4_ = 0xff800000;
            auVar269._24_4_ = 0xff800000;
            auVar269._28_4_ = 0xff800000;
            auVar286._8_4_ = 0x7f800000;
            auVar286._0_8_ = 0x7f8000007f800000;
            auVar286._12_4_ = 0x7f800000;
            auVar286._16_4_ = 0x7f800000;
            auVar286._20_4_ = 0x7f800000;
            auVar286._24_4_ = 0x7f800000;
            auVar286._28_4_ = 0x7f800000;
            auVar217 = vblendvps_avx(auVar286,auVar269,auVar285);
            auVar246 = vpackssdw_avx(auVar6._0_16_,auVar6._16_16_);
            auVar10 = vpmovsxwd_avx2(auVar246);
            auVar250 = vblendvps_avx(auVar250,auVar217,auVar10);
            auVar217 = vblendvps_avx(auVar269,auVar286,auVar285);
            auVar265 = vblendvps_avx(auVar265,auVar217,auVar10);
            auVar218._0_8_ = auVar6._0_8_ ^ 0xffffffffffffffff;
            auVar218._8_4_ = auVar6._8_4_ ^ 0xffffffff;
            auVar218._12_4_ = auVar6._12_4_ ^ 0xffffffff;
            auVar218._16_4_ = auVar6._16_4_ ^ 0xffffffff;
            auVar218._20_4_ = auVar6._20_4_ ^ 0xffffffff;
            auVar218._24_4_ = auVar6._24_4_ ^ 0xffffffff;
            auVar218._28_4_ = auVar6._28_4_ ^ 0xffffffff;
            auVar217 = vorps_avx(auVar285,auVar218);
            local_ac0 = vandps_avx(auVar199,auVar217);
          }
          auVar270 = ZEXT3264(auVar200);
        }
        uVar90 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
        auVar226._4_4_ = uVar90;
        auVar226._0_4_ = uVar90;
        auVar226._8_4_ = uVar90;
        auVar226._12_4_ = uVar90;
        auVar226._16_4_ = uVar90;
        auVar226._20_4_ = uVar90;
        auVar226._24_4_ = uVar90;
        auVar226._28_4_ = uVar90;
        uVar90 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
        auVar232._4_4_ = uVar90;
        auVar232._0_4_ = uVar90;
        auVar232._8_4_ = uVar90;
        auVar232._12_4_ = uVar90;
        auVar232._16_4_ = uVar90;
        auVar232._20_4_ = uVar90;
        auVar232._24_4_ = uVar90;
        auVar232._28_4_ = uVar90;
        auVar233 = ZEXT3264(auVar232);
        fVar187 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_580 = local_6e0;
        local_560 = vminps_avx(local_5a0,auVar250);
        _local_5c0 = vmaxps_avx(local_6e0,auVar265);
        auVar267 = ZEXT3264(_local_5c0);
        auVar217 = vcmpps_avx(local_6e0,local_560,2);
        auVar253 = ZEXT3264(auVar217);
        local_7a0 = vandps_avx(auVar217,auVar109);
        auVar217 = vcmpps_avx(_local_5c0,local_5a0,2);
        local_7e0 = vandps_avx(auVar217,auVar109);
        auVar109 = vorps_avx(local_7e0,local_7a0);
        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0x7f,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar109 >> 0xbf,0) != '\0') ||
            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar109[0x1f] < '\0') {
          _local_7c0 = _local_5c0;
          local_8e0._0_4_ = uVar85;
          auVar55._4_4_ = auVar234._4_4_ * fVar187;
          auVar55._0_4_ = auVar234._0_4_ * fVar187;
          auVar55._8_4_ = auVar234._8_4_ * fVar187;
          auVar55._12_4_ = auVar234._12_4_ * fVar187;
          auVar55._16_4_ = auVar234._16_4_ * fVar187;
          auVar55._20_4_ = auVar234._20_4_ * fVar187;
          auVar55._24_4_ = auVar234._24_4_ * fVar187;
          auVar55._28_4_ = auVar109._28_4_;
          auVar246 = vfmadd213ps_fma(auVar159,auVar232,auVar55);
          auVar56._4_4_ = auVar270._4_4_ * fVar187;
          auVar56._0_4_ = auVar270._0_4_ * fVar187;
          auVar56._8_4_ = auVar270._8_4_ * fVar187;
          auVar56._12_4_ = auVar270._12_4_ * fVar187;
          auVar56._16_4_ = auVar270._16_4_ * fVar187;
          auVar56._20_4_ = auVar270._20_4_ * fVar187;
          auVar56._24_4_ = auVar270._24_4_ * fVar187;
          auVar56._28_4_ = auVar109._28_4_;
          auVar7 = vfmadd213ps_fma(auVar141,auVar232,auVar56);
          auVar246 = vfmadd213ps_fma(auVar273._0_32_,auVar226,ZEXT1632(auVar246));
          auVar273 = ZEXT1664(auVar246);
          auVar162._0_8_ = local_ac0._0_8_ ^ 0xffffffffffffffff;
          auVar162._8_4_ = local_ac0._8_4_ ^ 0xffffffff;
          auVar162._12_4_ = local_ac0._12_4_ ^ 0xffffffff;
          auVar162._16_4_ = local_ac0._16_4_ ^ 0xffffffff;
          auVar162._20_4_ = local_ac0._20_4_ ^ 0xffffffff;
          auVar162._24_4_ = local_ac0._24_4_ ^ 0xffffffff;
          auVar162._28_4_ = local_ac0._28_4_ ^ 0xffffffff;
          auVar109 = vandps_avx(ZEXT1632(auVar246),local_700);
          auVar203._8_4_ = 0x3e99999a;
          auVar203._0_8_ = 0x3e99999a3e99999a;
          auVar203._12_4_ = 0x3e99999a;
          auVar203._16_4_ = 0x3e99999a;
          auVar203._20_4_ = 0x3e99999a;
          auVar203._24_4_ = 0x3e99999a;
          auVar203._28_4_ = 0x3e99999a;
          auVar109 = vcmpps_avx(auVar109,auVar203,1);
          local_640 = vorps_avx(auVar109,auVar162);
          auVar246 = vfmadd213ps_fma(auVar116,auVar226,ZEXT1632(auVar7));
          auVar109 = vandps_avx(ZEXT1632(auVar246),local_700);
          auVar109 = vcmpps_avx(auVar109,auVar203,1);
          auVar109 = vorps_avx(auVar109,auVar162);
          auVar144._8_4_ = 3;
          auVar144._0_8_ = 0x300000003;
          auVar144._12_4_ = 3;
          auVar144._16_4_ = 3;
          auVar144._20_4_ = 3;
          auVar144._24_4_ = 3;
          auVar144._28_4_ = 3;
          auVar163._8_4_ = 2;
          auVar163._0_8_ = 0x200000002;
          auVar163._12_4_ = 2;
          auVar163._16_4_ = 2;
          auVar163._20_4_ = 2;
          auVar163._24_4_ = 2;
          auVar163._28_4_ = 2;
          auVar109 = vblendvps_avx(auVar163,auVar144,auVar109);
          local_660._4_4_ = local_aec;
          local_660._0_4_ = local_aec;
          fStack_658 = (float)local_aec;
          fStack_654 = (float)local_aec;
          fStack_650 = (float)local_aec;
          fStack_64c = (float)local_aec;
          fStack_648 = (float)local_aec;
          uStack_644 = local_aec;
          local_620 = vpcmpgtd_avx2(auVar109,_local_660);
          auVar109 = vpandn_avx2(local_620,local_7a0);
          local_800._4_4_ = local_6e0._4_4_ + (float)local_820._4_4_;
          local_800._0_4_ = local_6e0._0_4_ + (float)local_820._0_4_;
          fStack_7f8 = local_6e0._8_4_ + fStack_818;
          fStack_7f4 = local_6e0._12_4_ + fStack_814;
          fStack_7f0 = local_6e0._16_4_ + fStack_810;
          fStack_7ec = local_6e0._20_4_ + fStack_80c;
          fStack_7e8 = local_6e0._24_4_ + fStack_808;
          fStack_7e4 = local_6e0._28_4_ + fStack_804;
          local_a60 = auVar13;
          local_a40 = auVar14;
          local_900 = auVar15;
          while( true ) {
            local_3a0 = auVar109;
            if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar109 >> 0x7f,0) == '\0') &&
                  (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar109 >> 0xbf,0) == '\0') &&
                (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar109[0x1f]) break;
            auVar145._8_4_ = 0x7f800000;
            auVar145._0_8_ = 0x7f8000007f800000;
            auVar145._12_4_ = 0x7f800000;
            auVar145._16_4_ = 0x7f800000;
            auVar145._20_4_ = 0x7f800000;
            auVar145._24_4_ = 0x7f800000;
            auVar145._28_4_ = 0x7f800000;
            auVar217 = vblendvps_avx(auVar145,local_6e0,auVar109);
            auVar6 = vshufps_avx(auVar217,auVar217,0xb1);
            auVar6 = vminps_avx(auVar217,auVar6);
            auVar199 = vshufpd_avx(auVar6,auVar6,5);
            auVar6 = vminps_avx(auVar6,auVar199);
            auVar199 = vpermpd_avx2(auVar6,0x4e);
            auVar6 = vminps_avx(auVar6,auVar199);
            auVar217 = vcmpps_avx(auVar217,auVar6,0);
            auVar6 = auVar109 & auVar217;
            if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar6 >> 0x7f,0) != '\0') ||
                  (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar6 >> 0xbf,0) != '\0') ||
                (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar6[0x1f] < '\0') {
              auVar109 = vandps_avx(auVar217,auVar109);
            }
            uVar78 = vmovmskps_avx(auVar109);
            iVar11 = 0;
            for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
              iVar11 = iVar11 + 1;
            }
            uVar83 = iVar11 << 2;
            *(undefined4 *)(local_3a0 + uVar83) = 0;
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_960._0_16_ = (undefined1  [16])aVar1;
            auVar246 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar78 = *(uint *)(local_1a0 + uVar83);
            uVar83 = *(uint *)(local_580 + uVar83);
            if (auVar246._0_4_ < 0.0) {
              auVar267 = ZEXT1664(auVar267._0_16_);
              auVar270 = ZEXT1664(auVar270._0_16_);
              auVar273 = ZEXT1664(auVar273._0_16_);
              fVar170 = sqrtf(auVar246._0_4_);
            }
            else {
              auVar246 = vsqrtss_avx(auVar246,auVar246);
              fVar170 = auVar246._0_4_;
            }
            auVar233 = ZEXT464(uVar83);
            auVar7 = vminps_avx(local_9d0,local_9f0);
            auVar246 = vmaxps_avx(local_9d0,local_9f0);
            auVar100 = vminps_avx(local_9e0,_local_a00);
            auVar274 = vminps_avx(auVar7,auVar100);
            auVar7 = vmaxps_avx(local_9e0,_local_a00);
            auVar100 = vmaxps_avx(auVar246,auVar7);
            auVar246 = vandps_avx(auVar274,local_a10);
            auVar7 = vandps_avx(auVar100,local_a10);
            auVar246 = vmaxps_avx(auVar246,auVar7);
            auVar7 = vmovshdup_avx(auVar246);
            auVar7 = vmaxss_avx(auVar7,auVar246);
            auVar246 = vshufpd_avx(auVar246,auVar246,1);
            auVar246 = vmaxss_avx(auVar246,auVar7);
            local_860._0_4_ = auVar246._0_4_ * 1.9073486e-06;
            local_740._0_4_ = fVar170 * 1.9073486e-06;
            local_780._0_16_ = vshufps_avx(auVar100,auVar100,0xff);
            auVar246 = vinsertps_avx(ZEXT416(uVar83),ZEXT416(uVar78),0x10);
            auVar253 = ZEXT1664(auVar246);
            lVar82 = 5;
            do {
              do {
                auVar246 = auVar253._0_16_;
                bVar87 = lVar82 == 0;
                lVar82 = lVar82 + -1;
                if (bVar87) goto LAB_0111173d;
                local_980._0_16_ = vmovshdup_avx(auVar246);
                fVar187 = local_980._0_4_;
                fVar219 = 1.0 - fVar187;
                fVar206 = fVar219 * fVar219 * fVar219;
                fVar207 = fVar187 * fVar187;
                fVar205 = fVar187 * fVar207;
                auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar206),
                                           ZEXT416((uint)fVar205));
                fVar170 = fVar187 * fVar219;
                auVar274 = vfmadd231ss_fma(ZEXT416((uint)(fVar187 * fVar170 * 6.0)),
                                           ZEXT416((uint)(fVar219 * fVar170)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar170 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar187 * fVar170)));
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar205),
                                         ZEXT416((uint)fVar206));
                fVar187 = (auVar7._0_4_ + auVar8._0_4_) * 0.16666667;
                fVar205 = fVar205 * 0.16666667;
                auVar136._0_4_ = fVar205 * (float)local_a00._0_4_;
                auVar136._4_4_ = fVar205 * (float)local_a00._4_4_;
                auVar136._8_4_ = fVar205 * fStack_9f8;
                auVar136._12_4_ = fVar205 * fStack_9f4;
                auVar172._4_4_ = fVar187;
                auVar172._0_4_ = fVar187;
                auVar172._8_4_ = fVar187;
                auVar172._12_4_ = fVar187;
                auVar7 = vfmadd132ps_fma(auVar172,auVar136,local_9e0);
                fVar187 = (auVar100._0_4_ + auVar274._0_4_) * 0.16666667;
                auVar137._4_4_ = fVar187;
                auVar137._0_4_ = fVar187;
                auVar137._8_4_ = fVar187;
                auVar137._12_4_ = fVar187;
                auVar7 = vfmadd132ps_fma(auVar137,auVar7,local_9f0);
                fVar205 = auVar253._0_4_;
                auVar150._4_4_ = fVar205;
                auVar150._0_4_ = fVar205;
                auVar150._8_4_ = fVar205;
                auVar150._12_4_ = fVar205;
                auVar100 = vfmadd213ps_fma(auVar150,local_960._0_16_,_DAT_01f45a50);
                fVar206 = fVar206 * 0.16666667;
                auVar99._4_4_ = fVar206;
                auVar99._0_4_ = fVar206;
                auVar99._8_4_ = fVar206;
                auVar99._12_4_ = fVar206;
                auVar7 = vfmadd132ps_fma(auVar99,auVar7,local_9d0);
                local_720._0_16_ = auVar7;
                auVar7 = vsubps_avx(auVar100,auVar7);
                _local_880 = auVar7;
                auVar7 = vdpps_avx(auVar7,auVar7,0x7f);
                fVar187 = auVar7._0_4_;
                if (fVar187 < 0.0) {
                  local_9a0._0_16_ = ZEXT416((uint)fVar219);
                  local_a40._0_4_ = fVar207;
                  local_a60._0_4_ = fVar170;
                  auVar270._0_4_ = sqrtf(fVar187);
                  auVar270._4_60_ = extraout_var;
                  auVar100 = auVar270._0_16_;
                  fVar170 = (float)local_a60._0_4_;
                  fVar207 = (float)local_a40._0_4_;
                  auVar274 = local_9a0._0_16_;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar7,auVar7);
                  auVar274 = ZEXT416((uint)fVar219);
                }
                fVar206 = auVar274._0_4_;
                auVar101._4_4_ = fVar206;
                auVar101._0_4_ = fVar206;
                auVar101._8_4_ = fVar206;
                auVar101._12_4_ = fVar206;
                auVar9 = vfnmsub213ss_fma(local_980._0_16_,local_980._0_16_,
                                          ZEXT416((uint)(fVar170 * 4.0)));
                auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * 4.0)),auVar274,auVar274);
                fVar170 = fVar206 * -fVar206 * 0.5;
                fVar206 = auVar9._0_4_ * 0.5;
                fVar219 = auVar8._0_4_ * 0.5;
                fVar207 = fVar207 * 0.5;
                auVar213._0_4_ = (float)local_a00._0_4_ * fVar207;
                auVar213._4_4_ = (float)local_a00._4_4_ * fVar207;
                auVar213._8_4_ = fStack_9f8 * fVar207;
                auVar213._12_4_ = fStack_9f4 * fVar207;
                auVar173._4_4_ = fVar219;
                auVar173._0_4_ = fVar219;
                auVar173._8_4_ = fVar219;
                auVar173._12_4_ = fVar219;
                auVar8 = vfmadd213ps_fma(auVar173,local_9e0,auVar213);
                auVar190._4_4_ = fVar206;
                auVar190._0_4_ = fVar206;
                auVar190._8_4_ = fVar206;
                auVar190._12_4_ = fVar206;
                auVar8 = vfmadd213ps_fma(auVar190,local_9f0,auVar8);
                auVar262._4_4_ = fVar170;
                auVar262._0_4_ = fVar170;
                auVar262._8_4_ = fVar170;
                auVar262._12_4_ = fVar170;
                auVar96 = vfmadd213ps_fma(auVar262,local_9d0,auVar8);
                auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar274,local_980._0_16_);
                auVar9 = vfmadd213ss_fma(local_980._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar274);
                auVar274 = vshufps_avx(auVar246,auVar246,0x55);
                auVar174._0_4_ = (float)local_a00._0_4_ * auVar274._0_4_;
                auVar174._4_4_ = (float)local_a00._4_4_ * auVar274._4_4_;
                auVar174._8_4_ = fStack_9f8 * auVar274._8_4_;
                auVar174._12_4_ = fStack_9f4 * auVar274._12_4_;
                uVar85 = auVar9._0_4_;
                auVar191._4_4_ = uVar85;
                auVar191._0_4_ = uVar85;
                auVar191._8_4_ = uVar85;
                auVar191._12_4_ = uVar85;
                auVar274 = vfmadd213ps_fma(auVar191,local_9e0,auVar174);
                auVar151._0_4_ = auVar8._0_4_;
                auVar151._4_4_ = auVar151._0_4_;
                auVar151._8_4_ = auVar151._0_4_;
                auVar151._12_4_ = auVar151._0_4_;
                auVar274 = vfmadd213ps_fma(auVar151,local_9f0,auVar274);
                auVar95 = vfmadd231ps_fma(auVar274,local_9d0,auVar101);
                auVar8 = vdpps_avx(auVar96,auVar96,0x7f);
                auVar274 = vblendps_avx(auVar8,_DAT_01f45a50,0xe);
                auVar9 = vrsqrtss_avx(auVar274,auVar274);
                fVar170 = auVar9._0_4_;
                fVar207 = auVar8._0_4_;
                fVar170 = fVar170 * 1.5 + fVar207 * -0.5 * fVar170 * fVar170 * fVar170;
                auVar9 = vdpps_avx(auVar96,auVar95,0x7f);
                auVar152._0_4_ = auVar95._0_4_ * fVar207;
                auVar152._4_4_ = auVar95._4_4_ * fVar207;
                auVar152._8_4_ = auVar95._8_4_ * fVar207;
                auVar152._12_4_ = auVar95._12_4_ * fVar207;
                fVar206 = auVar9._0_4_;
                auVar214._0_4_ = auVar96._0_4_ * fVar206;
                auVar214._4_4_ = auVar96._4_4_ * fVar206;
                fVar219 = auVar96._8_4_;
                auVar214._8_4_ = fVar219 * fVar206;
                fVar220 = auVar96._12_4_;
                auVar214._12_4_ = fVar220 * fVar206;
                auVar9 = vsubps_avx(auVar152,auVar214);
                auVar274 = vrcpss_avx(auVar274,auVar274);
                auVar95 = vfnmadd213ss_fma(auVar274,auVar8,ZEXT416(0x40000000));
                fVar206 = auVar274._0_4_ * auVar95._0_4_;
                auVar274 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                      ZEXT416((uint)(fVar205 * (float)local_740._0_4_)));
                auVar242 = ZEXT1664(auVar274);
                auVar229._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
                auVar229._8_4_ = -fVar219;
                auVar229._12_4_ = -fVar220;
                auVar175._0_4_ = fVar170 * auVar9._0_4_ * fVar206;
                auVar175._4_4_ = fVar170 * auVar9._4_4_ * fVar206;
                auVar175._8_4_ = fVar170 * auVar9._8_4_ * fVar206;
                auVar175._12_4_ = fVar170 * auVar9._12_4_ * fVar206;
                auVar247._0_4_ = auVar96._0_4_ * fVar170;
                auVar247._4_4_ = auVar96._4_4_ * fVar170;
                auVar247._8_4_ = fVar219 * fVar170;
                auVar247._12_4_ = fVar220 * fVar170;
                local_980._0_16_ = auVar96;
                local_9a0._0_4_ = auVar274._0_4_;
                if (fVar207 < -fVar207) {
                  local_a40._0_4_ = auVar100._0_4_;
                  local_a60._0_16_ = auVar229;
                  local_900._0_16_ = auVar247;
                  local_9c0._0_16_ = auVar175;
                  fVar170 = sqrtf(fVar207);
                  auVar242 = ZEXT464((uint)local_9a0._0_4_);
                  auVar100 = ZEXT416((uint)local_a40._0_4_);
                  auVar175 = local_9c0._0_16_;
                  auVar229 = local_a60._0_16_;
                  auVar247 = local_900._0_16_;
                }
                else {
                  auVar274 = vsqrtss_avx(auVar8,auVar8);
                  fVar170 = auVar274._0_4_;
                }
                auVar274 = vdpps_avx(_local_880,auVar247,0x7f);
                auVar95 = vfmadd213ss_fma(ZEXT416((uint)local_860._0_4_),auVar100,auVar242._0_16_);
                auVar8 = vdpps_avx(auVar229,auVar247,0x7f);
                auVar9 = vdpps_avx(_local_880,auVar175,0x7f);
                auVar96 = vdpps_avx(local_960._0_16_,auVar247,0x7f);
                auVar95 = vfmadd213ss_fma(ZEXT416((uint)(auVar100._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_860._0_4_ / fVar170)),auVar95)
                ;
                auVar270 = ZEXT1664(auVar95);
                fVar170 = auVar8._0_4_ + auVar9._0_4_;
                auVar273 = ZEXT464((uint)fVar170);
                auVar102._0_4_ = auVar274._0_4_ * auVar274._0_4_;
                auVar102._4_4_ = auVar274._4_4_ * auVar274._4_4_;
                auVar102._8_4_ = auVar274._8_4_ * auVar274._8_4_;
                auVar102._12_4_ = auVar274._12_4_ * auVar274._12_4_;
                auVar100 = vdpps_avx(_local_880,auVar229,0x7f);
                auVar9 = vsubps_avx(auVar7,auVar102);
                auVar8 = vrsqrtss_avx(auVar9,auVar9);
                fVar206 = auVar9._0_4_;
                fVar205 = auVar8._0_4_;
                fVar205 = fVar205 * 1.5 + fVar206 * -0.5 * fVar205 * fVar205 * fVar205;
                auVar8 = vdpps_avx(_local_880,local_960._0_16_,0x7f);
                auVar100 = vfnmadd231ss_fma(auVar100,auVar274,ZEXT416((uint)fVar170));
                auVar8 = vfnmadd231ss_fma(auVar8,auVar274,auVar96);
                if (fVar206 < 0.0) {
                  local_a40._0_16_ = auVar274;
                  local_a60._0_4_ = auVar95._0_4_;
                  local_900._0_16_ = ZEXT416((uint)fVar170);
                  local_9c0._0_16_ = auVar96;
                  local_8a0._0_16_ = auVar100;
                  local_8c0._0_4_ = fVar205;
                  local_760._0_16_ = auVar8;
                  fVar170 = sqrtf(fVar206);
                  auVar273 = ZEXT1664(local_900._0_16_);
                  auVar270 = ZEXT464((uint)local_a60._0_4_);
                  auVar242 = ZEXT464((uint)local_9a0._0_4_);
                  fVar205 = (float)local_8c0._0_4_;
                  auVar8 = local_760._0_16_;
                  auVar274 = local_a40._0_16_;
                  auVar96 = local_9c0._0_16_;
                  auVar100 = local_8a0._0_16_;
                }
                else {
                  auVar9 = vsqrtss_avx(auVar9,auVar9);
                  fVar170 = auVar9._0_4_;
                }
                auVar267 = ZEXT1664(auVar274);
                auVar233 = ZEXT1664(local_980._0_16_);
                auVar9 = vpermilps_avx(local_720._0_16_,0xff);
                fVar170 = fVar170 - auVar9._0_4_;
                auVar9 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xff);
                auVar100 = vfmsub213ss_fma(auVar100,ZEXT416((uint)fVar205),auVar9);
                auVar176._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
                auVar176._8_4_ = auVar96._8_4_ ^ 0x80000000;
                auVar176._12_4_ = auVar96._12_4_ ^ 0x80000000;
                auVar192._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
                auVar192._8_4_ = auVar100._8_4_ ^ 0x80000000;
                auVar192._12_4_ = auVar100._12_4_ ^ 0x80000000;
                auVar95 = ZEXT416((uint)(auVar8._0_4_ * fVar205));
                auVar148 = auVar273._0_16_;
                auVar8 = vfmsub231ss_fma(ZEXT416((uint)(auVar96._0_4_ * auVar100._0_4_)),auVar148,
                                         auVar95);
                auVar100 = vinsertps_avx(auVar192,auVar95,0x1c);
                uVar85 = auVar8._0_4_;
                auVar193._4_4_ = uVar85;
                auVar193._0_4_ = uVar85;
                auVar193._8_4_ = uVar85;
                auVar193._12_4_ = uVar85;
                auVar100 = vdivps_avx(auVar100,auVar193);
                auVar8 = vinsertps_avx(auVar148,auVar176,0x10);
                auVar8 = vdivps_avx(auVar8,auVar193);
                fVar205 = auVar274._0_4_;
                auVar153._0_4_ = fVar205 * auVar100._0_4_ + fVar170 * auVar8._0_4_;
                auVar153._4_4_ = fVar205 * auVar100._4_4_ + fVar170 * auVar8._4_4_;
                auVar153._8_4_ = fVar205 * auVar100._8_4_ + fVar170 * auVar8._8_4_;
                auVar153._12_4_ = fVar205 * auVar100._12_4_ + fVar170 * auVar8._12_4_;
                auVar100 = vsubps_avx(auVar246,auVar153);
                auVar253 = ZEXT1664(auVar100);
                auVar246 = vandps_avx(auVar274,local_a10);
              } while (auVar270._0_4_ <= auVar246._0_4_);
              auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar242._0_4_ + auVar270._0_4_)),
                                       local_780._0_16_,ZEXT416(0x36000000));
              auVar246 = vandps_avx(ZEXT416((uint)fVar170),local_a10);
            } while (auVar8._0_4_ <= auVar246._0_4_);
            fVar170 = auVar100._0_4_ + (float)local_840._0_4_;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar170) &&
               (fVar205 = (ray->super_RayK<1>).tfar, fVar170 <= fVar205)) {
              auVar246 = vmovshdup_avx(auVar100);
              fVar206 = auVar246._0_4_;
              if ((0.0 <= fVar206) && (fVar206 <= 1.0)) {
                auVar246 = vrsqrtss_avx(auVar7,auVar7);
                fVar207 = auVar246._0_4_;
                pGVar4 = (context->scene->geometries).items[uVar79].ptr;
                if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar187 = fVar207 * 1.5 + fVar187 * -0.5 * fVar207 * fVar207 * fVar207;
                  auVar177._0_4_ = fVar187 * (float)local_880._0_4_;
                  auVar177._4_4_ = fVar187 * (float)local_880._4_4_;
                  auVar177._8_4_ = fVar187 * fStack_878;
                  auVar177._12_4_ = fVar187 * fStack_874;
                  auVar9 = vfmadd213ps_fma(auVar9,auVar177,local_980._0_16_);
                  auVar246 = vshufps_avx(auVar177,auVar177,0xc9);
                  auVar7 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xc9);
                  auVar178._0_4_ = auVar177._0_4_ * auVar7._0_4_;
                  auVar178._4_4_ = auVar177._4_4_ * auVar7._4_4_;
                  auVar178._8_4_ = auVar177._8_4_ * auVar7._8_4_;
                  auVar178._12_4_ = auVar177._12_4_ * auVar7._12_4_;
                  auVar8 = vfmsub231ps_fma(auVar178,local_980._0_16_,auVar246);
                  auVar246 = vshufps_avx(auVar8,auVar8,0xc9);
                  auVar7 = vshufps_avx(auVar9,auVar9,0xc9);
                  auVar8 = vshufps_avx(auVar8,auVar8,0xd2);
                  auVar103._0_4_ = auVar9._0_4_ * auVar8._0_4_;
                  auVar103._4_4_ = auVar9._4_4_ * auVar8._4_4_;
                  auVar103._8_4_ = auVar9._8_4_ * auVar8._8_4_;
                  auVar103._12_4_ = auVar9._12_4_ * auVar8._12_4_;
                  auVar7 = vfmsub231ps_fma(auVar103,auVar246,auVar7);
                  auVar246 = vshufps_avx(auVar7,auVar7,0xe9);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar170;
                    uVar91 = vmovlps_avx(auVar246);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar91;
                    (ray->Ng).field_0.field_0.z = auVar7._0_4_;
                    ray->u = fVar206;
                    ray->v = 0.0;
                    ray->primID = local_8e0._0_4_;
                    ray->geomID = uVar79;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_930 = vmovlps_avx(auVar246);
                    local_928 = auVar7._0_4_;
                    local_924 = fVar206;
                    local_920 = 0;
                    local_91c = local_8e0._0_4_;
                    local_918 = uVar79;
                    local_914 = context->user->instID[0];
                    local_910 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar170;
                    local_680._0_4_ = 0xffffffff;
                    local_a98.valid = (int *)local_680;
                    local_a98.geometryUserPtr = pGVar4->userPtr;
                    local_a98.context = context->user;
                    local_a98.hit = (RTCHitN *)&local_930;
                    local_a98.N = 1;
                    local_a98.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01111841:
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar233 = ZEXT1664(auVar233._0_16_);
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        auVar270 = ZEXT1664(auVar270._0_16_);
                        auVar273 = ZEXT1664(auVar273._0_16_);
                        (*p_Var5)(&local_a98);
                        if (*local_a98.valid == 0) goto LAB_011118d1;
                      }
                      (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).components[0] =
                           *(float *)local_a98.hit;
                      (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_a98.hit + 4);
                      (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_a98.hit + 8);
                      *(float *)((long)local_a98.ray + 0x3c) = *(float *)(local_a98.hit + 0xc);
                      *(float *)((long)local_a98.ray + 0x40) = *(float *)(local_a98.hit + 0x10);
                      *(float *)((long)local_a98.ray + 0x44) = *(float *)(local_a98.hit + 0x14);
                      *(float *)((long)local_a98.ray + 0x48) = *(float *)(local_a98.hit + 0x18);
                      *(float *)((long)local_a98.ray + 0x4c) = *(float *)(local_a98.hit + 0x1c);
                      *(float *)((long)local_a98.ray + 0x50) = *(float *)(local_a98.hit + 0x20);
                    }
                    else {
                      auVar233 = ZEXT1664(local_980._0_16_);
                      auVar253 = ZEXT1664(auVar100);
                      auVar267 = ZEXT1664(auVar274);
                      auVar270 = ZEXT1664(auVar270._0_16_);
                      auVar273 = ZEXT1664(auVar148);
                      (*pGVar4->intersectionFilterN)(&local_a98);
                      if (*local_a98.valid != 0) goto LAB_01111841;
LAB_011118d1:
                      (ray->super_RayK<1>).tfar = fVar205;
                    }
                  }
                }
              }
            }
LAB_0111173d:
            fVar170 = (ray->super_RayK<1>).tfar;
            auVar119._4_4_ = fVar170;
            auVar119._0_4_ = fVar170;
            auVar119._8_4_ = fVar170;
            auVar119._12_4_ = fVar170;
            auVar119._16_4_ = fVar170;
            auVar119._20_4_ = fVar170;
            auVar119._24_4_ = fVar170;
            auVar119._28_4_ = fVar170;
            auVar109 = vcmpps_avx(_local_800,auVar119,2);
            auVar109 = vandps_avx(auVar109,local_3a0);
          }
          auVar120._0_4_ = (float)local_820._0_4_ + (float)local_7c0._0_4_;
          auVar120._4_4_ = (float)local_820._4_4_ + (float)local_7c0._4_4_;
          auVar120._8_4_ = fStack_818 + fStack_7b8;
          auVar120._12_4_ = fStack_814 + fStack_7b4;
          auVar120._16_4_ = fStack_810 + fStack_7b0;
          auVar120._20_4_ = fStack_80c + fStack_7ac;
          auVar120._24_4_ = fStack_808 + fStack_7a8;
          auVar120._28_4_ = fStack_804 + fStack_7a4;
          fVar187 = (ray->super_RayK<1>).tfar;
          fVar170 = (ray->super_RayK<1>).tfar;
          auVar164._4_4_ = fVar170;
          auVar164._0_4_ = fVar170;
          auVar164._8_4_ = fVar170;
          auVar164._12_4_ = fVar170;
          auVar164._16_4_ = fVar170;
          auVar164._20_4_ = fVar170;
          auVar164._24_4_ = fVar170;
          auVar164._28_4_ = fVar170;
          auVar109 = vcmpps_avx(auVar120,auVar164,2);
          local_7e0 = vandps_avx(auVar109,local_7e0);
          auVar121._8_4_ = 3;
          auVar121._0_8_ = 0x300000003;
          auVar121._12_4_ = 3;
          auVar121._16_4_ = 3;
          auVar121._20_4_ = 3;
          auVar121._24_4_ = 3;
          auVar121._28_4_ = 3;
          auVar165._8_4_ = 2;
          auVar165._0_8_ = 0x200000002;
          auVar165._12_4_ = 2;
          auVar165._16_4_ = 2;
          auVar165._20_4_ = 2;
          auVar165._24_4_ = 2;
          auVar165._28_4_ = 2;
          auVar109 = vblendvps_avx(auVar165,auVar121,local_640);
          _local_800 = vpcmpgtd_avx2(auVar109,_local_660);
          auVar109 = vpandn_avx2(_local_800,local_7e0);
          local_6e0 = _local_5c0;
          local_7c0._4_4_ = (float)local_820._4_4_ + (float)local_5c0._4_4_;
          local_7c0._0_4_ = (float)local_820._0_4_ + (float)local_5c0._0_4_;
          fStack_7b8 = fStack_818 + fStack_5b8;
          fStack_7b4 = fStack_814 + fStack_5b4;
          fStack_7b0 = fStack_810 + fStack_5b0;
          fStack_7ac = fStack_80c + fStack_5ac;
          fStack_7a8 = fStack_808 + fStack_5a8;
          fStack_7a4 = fStack_804 + fStack_5a4;
          fVar170 = (float)local_820._0_4_;
          fVar206 = (float)local_820._4_4_;
          fVar219 = fStack_818;
          fVar221 = fStack_814;
          fVar258 = fStack_810;
          fVar125 = fStack_80c;
          fVar129 = fStack_808;
          fVar132 = fStack_804;
          while( true ) {
            local_680 = auVar109;
            if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar109 >> 0x7f,0) == '\0') &&
                  (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar109 >> 0xbf,0) == '\0') &&
                (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar109[0x1f]) break;
            auVar146._8_4_ = 0x7f800000;
            auVar146._0_8_ = 0x7f8000007f800000;
            auVar146._12_4_ = 0x7f800000;
            auVar146._16_4_ = 0x7f800000;
            auVar146._20_4_ = 0x7f800000;
            auVar146._24_4_ = 0x7f800000;
            auVar146._28_4_ = 0x7f800000;
            auVar217 = vblendvps_avx(auVar146,local_6e0,auVar109);
            auVar6 = vshufps_avx(auVar217,auVar217,0xb1);
            auVar6 = vminps_avx(auVar217,auVar6);
            auVar199 = vshufpd_avx(auVar6,auVar6,5);
            auVar6 = vminps_avx(auVar6,auVar199);
            auVar199 = vpermpd_avx2(auVar6,0x4e);
            auVar6 = vminps_avx(auVar6,auVar199);
            auVar217 = vcmpps_avx(auVar217,auVar6,0);
            auVar6 = auVar109 & auVar217;
            if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar6 >> 0x7f,0) != '\0') ||
                  (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar6 >> 0xbf,0) != '\0') ||
                (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar6[0x1f] < '\0') {
              auVar109 = vandps_avx(auVar217,auVar109);
            }
            uVar78 = vmovmskps_avx(auVar109);
            iVar11 = 0;
            for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
              iVar11 = iVar11 + 1;
            }
            uVar83 = iVar11 << 2;
            *(undefined4 *)(local_680 + uVar83) = 0;
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_960._0_16_ = (undefined1  [16])aVar1;
            auVar246 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar78 = *(uint *)(local_1c0 + uVar83);
            uVar83 = *(uint *)(local_5a0 + uVar83);
            if (auVar246._0_4_ < 0.0) {
              auVar267 = ZEXT1664(auVar267._0_16_);
              auVar270 = ZEXT1664(auVar270._0_16_);
              auVar273 = ZEXT1664(auVar273._0_16_);
              fVar170 = sqrtf(auVar246._0_4_);
            }
            else {
              auVar246 = vsqrtss_avx(auVar246,auVar246);
              fVar170 = auVar246._0_4_;
            }
            auVar233 = ZEXT464(uVar83);
            auVar7 = vminps_avx(local_9d0,local_9f0);
            auVar246 = vmaxps_avx(local_9d0,local_9f0);
            auVar100 = vminps_avx(local_9e0,_local_a00);
            auVar274 = vminps_avx(auVar7,auVar100);
            auVar7 = vmaxps_avx(local_9e0,_local_a00);
            auVar100 = vmaxps_avx(auVar246,auVar7);
            auVar246 = vandps_avx(auVar274,local_a10);
            auVar7 = vandps_avx(auVar100,local_a10);
            auVar246 = vmaxps_avx(auVar246,auVar7);
            auVar7 = vmovshdup_avx(auVar246);
            auVar7 = vmaxss_avx(auVar7,auVar246);
            auVar246 = vshufpd_avx(auVar246,auVar246,1);
            auVar246 = vmaxss_avx(auVar246,auVar7);
            local_860._0_4_ = auVar246._0_4_ * 1.9073486e-06;
            local_740._0_4_ = fVar170 * 1.9073486e-06;
            local_780._0_16_ = vshufps_avx(auVar100,auVar100,0xff);
            auVar246 = vinsertps_avx(ZEXT416(uVar83),ZEXT416(uVar78),0x10);
            auVar253 = ZEXT1664(auVar246);
            lVar82 = 5;
            do {
              do {
                auVar246 = auVar253._0_16_;
                bVar87 = lVar82 == 0;
                lVar82 = lVar82 + -1;
                if (bVar87) goto LAB_01112140;
                local_980._0_16_ = vmovshdup_avx(auVar246);
                fVar187 = local_980._0_4_;
                fVar219 = 1.0 - fVar187;
                fVar206 = fVar219 * fVar219 * fVar219;
                fVar207 = fVar187 * fVar187;
                fVar205 = fVar187 * fVar207;
                auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar206),
                                           ZEXT416((uint)fVar205));
                fVar170 = fVar187 * fVar219;
                auVar274 = vfmadd231ss_fma(ZEXT416((uint)(fVar187 * fVar170 * 6.0)),
                                           ZEXT416((uint)(fVar219 * fVar170)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar170 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar187 * fVar170)));
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar205),
                                         ZEXT416((uint)fVar206));
                fVar187 = (auVar7._0_4_ + auVar8._0_4_) * 0.16666667;
                fVar205 = fVar205 * 0.16666667;
                auVar138._0_4_ = fVar205 * (float)local_a00._0_4_;
                auVar138._4_4_ = fVar205 * (float)local_a00._4_4_;
                auVar138._8_4_ = fVar205 * fStack_9f8;
                auVar138._12_4_ = fVar205 * fStack_9f4;
                auVar179._4_4_ = fVar187;
                auVar179._0_4_ = fVar187;
                auVar179._8_4_ = fVar187;
                auVar179._12_4_ = fVar187;
                auVar7 = vfmadd132ps_fma(auVar179,auVar138,local_9e0);
                fVar187 = (auVar100._0_4_ + auVar274._0_4_) * 0.16666667;
                auVar139._4_4_ = fVar187;
                auVar139._0_4_ = fVar187;
                auVar139._8_4_ = fVar187;
                auVar139._12_4_ = fVar187;
                auVar7 = vfmadd132ps_fma(auVar139,auVar7,local_9f0);
                fVar205 = auVar253._0_4_;
                auVar154._4_4_ = fVar205;
                auVar154._0_4_ = fVar205;
                auVar154._8_4_ = fVar205;
                auVar154._12_4_ = fVar205;
                auVar100 = vfmadd213ps_fma(auVar154,local_960._0_16_,_DAT_01f45a50);
                fVar206 = fVar206 * 0.16666667;
                auVar104._4_4_ = fVar206;
                auVar104._0_4_ = fVar206;
                auVar104._8_4_ = fVar206;
                auVar104._12_4_ = fVar206;
                auVar7 = vfmadd132ps_fma(auVar104,auVar7,local_9d0);
                local_720._0_16_ = auVar7;
                auVar7 = vsubps_avx(auVar100,auVar7);
                _local_880 = auVar7;
                auVar7 = vdpps_avx(auVar7,auVar7,0x7f);
                fVar187 = auVar7._0_4_;
                if (fVar187 < 0.0) {
                  local_9a0._0_16_ = ZEXT416((uint)fVar219);
                  local_a40._0_4_ = fVar207;
                  local_a60._0_4_ = fVar170;
                  auVar267._0_4_ = sqrtf(fVar187);
                  auVar267._4_60_ = extraout_var_00;
                  auVar100 = auVar267._0_16_;
                  fVar170 = (float)local_a60._0_4_;
                  fVar207 = (float)local_a40._0_4_;
                  auVar274 = local_9a0._0_16_;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar7,auVar7);
                  auVar274 = ZEXT416((uint)fVar219);
                }
                fVar206 = auVar274._0_4_;
                auVar105._4_4_ = fVar206;
                auVar105._0_4_ = fVar206;
                auVar105._8_4_ = fVar206;
                auVar105._12_4_ = fVar206;
                auVar9 = vfnmsub213ss_fma(local_980._0_16_,local_980._0_16_,
                                          ZEXT416((uint)(fVar170 * 4.0)));
                auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * 4.0)),auVar274,auVar274);
                fVar170 = fVar206 * -fVar206 * 0.5;
                fVar206 = auVar9._0_4_ * 0.5;
                fVar219 = auVar8._0_4_ * 0.5;
                fVar207 = fVar207 * 0.5;
                auVar215._0_4_ = (float)local_a00._0_4_ * fVar207;
                auVar215._4_4_ = (float)local_a00._4_4_ * fVar207;
                auVar215._8_4_ = fStack_9f8 * fVar207;
                auVar215._12_4_ = fStack_9f4 * fVar207;
                auVar180._4_4_ = fVar219;
                auVar180._0_4_ = fVar219;
                auVar180._8_4_ = fVar219;
                auVar180._12_4_ = fVar219;
                auVar8 = vfmadd213ps_fma(auVar180,local_9e0,auVar215);
                auVar194._4_4_ = fVar206;
                auVar194._0_4_ = fVar206;
                auVar194._8_4_ = fVar206;
                auVar194._12_4_ = fVar206;
                auVar8 = vfmadd213ps_fma(auVar194,local_9f0,auVar8);
                auVar263._4_4_ = fVar170;
                auVar263._0_4_ = fVar170;
                auVar263._8_4_ = fVar170;
                auVar263._12_4_ = fVar170;
                auVar96 = vfmadd213ps_fma(auVar263,local_9d0,auVar8);
                auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar274,local_980._0_16_);
                auVar9 = vfmadd213ss_fma(local_980._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar274);
                auVar274 = vshufps_avx(auVar246,auVar246,0x55);
                auVar181._0_4_ = (float)local_a00._0_4_ * auVar274._0_4_;
                auVar181._4_4_ = (float)local_a00._4_4_ * auVar274._4_4_;
                auVar181._8_4_ = fStack_9f8 * auVar274._8_4_;
                auVar181._12_4_ = fStack_9f4 * auVar274._12_4_;
                uVar85 = auVar9._0_4_;
                auVar195._4_4_ = uVar85;
                auVar195._0_4_ = uVar85;
                auVar195._8_4_ = uVar85;
                auVar195._12_4_ = uVar85;
                auVar274 = vfmadd213ps_fma(auVar195,local_9e0,auVar181);
                auVar155._0_4_ = auVar8._0_4_;
                auVar155._4_4_ = auVar155._0_4_;
                auVar155._8_4_ = auVar155._0_4_;
                auVar155._12_4_ = auVar155._0_4_;
                auVar274 = vfmadd213ps_fma(auVar155,local_9f0,auVar274);
                auVar95 = vfmadd231ps_fma(auVar274,local_9d0,auVar105);
                auVar8 = vdpps_avx(auVar96,auVar96,0x7f);
                auVar274 = vblendps_avx(auVar8,_DAT_01f45a50,0xe);
                auVar9 = vrsqrtss_avx(auVar274,auVar274);
                fVar170 = auVar9._0_4_;
                fVar207 = auVar8._0_4_;
                fVar170 = fVar170 * 1.5 + fVar207 * -0.5 * fVar170 * fVar170 * fVar170;
                auVar9 = vdpps_avx(auVar96,auVar95,0x7f);
                auVar156._0_4_ = auVar95._0_4_ * fVar207;
                auVar156._4_4_ = auVar95._4_4_ * fVar207;
                auVar156._8_4_ = auVar95._8_4_ * fVar207;
                auVar156._12_4_ = auVar95._12_4_ * fVar207;
                fVar206 = auVar9._0_4_;
                auVar216._0_4_ = auVar96._0_4_ * fVar206;
                auVar216._4_4_ = auVar96._4_4_ * fVar206;
                fVar219 = auVar96._8_4_;
                auVar216._8_4_ = fVar219 * fVar206;
                fVar220 = auVar96._12_4_;
                auVar216._12_4_ = fVar220 * fVar206;
                auVar9 = vsubps_avx(auVar156,auVar216);
                auVar274 = vrcpss_avx(auVar274,auVar274);
                auVar95 = vfnmadd213ss_fma(auVar274,auVar8,ZEXT416(0x40000000));
                fVar206 = auVar274._0_4_ * auVar95._0_4_;
                auVar274 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                      ZEXT416((uint)(fVar205 * (float)local_740._0_4_)));
                auVar242 = ZEXT1664(auVar274);
                auVar230._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
                auVar230._8_4_ = -fVar219;
                auVar230._12_4_ = -fVar220;
                auVar182._0_4_ = fVar170 * auVar9._0_4_ * fVar206;
                auVar182._4_4_ = fVar170 * auVar9._4_4_ * fVar206;
                auVar182._8_4_ = fVar170 * auVar9._8_4_ * fVar206;
                auVar182._12_4_ = fVar170 * auVar9._12_4_ * fVar206;
                auVar248._0_4_ = auVar96._0_4_ * fVar170;
                auVar248._4_4_ = auVar96._4_4_ * fVar170;
                auVar248._8_4_ = fVar219 * fVar170;
                auVar248._12_4_ = fVar220 * fVar170;
                local_980._0_16_ = auVar96;
                local_9a0._0_4_ = auVar274._0_4_;
                if (fVar207 < -fVar207) {
                  local_a40._0_4_ = auVar100._0_4_;
                  local_a60._0_16_ = auVar230;
                  local_900._0_16_ = auVar248;
                  local_9c0._0_16_ = auVar182;
                  fVar170 = sqrtf(fVar207);
                  auVar242 = ZEXT464((uint)local_9a0._0_4_);
                  auVar100 = ZEXT416((uint)local_a40._0_4_);
                  auVar182 = local_9c0._0_16_;
                  auVar230 = local_a60._0_16_;
                  auVar248 = local_900._0_16_;
                }
                else {
                  auVar274 = vsqrtss_avx(auVar8,auVar8);
                  fVar170 = auVar274._0_4_;
                }
                auVar274 = vdpps_avx(_local_880,auVar248,0x7f);
                auVar95 = vfmadd213ss_fma(ZEXT416((uint)local_860._0_4_),auVar100,auVar242._0_16_);
                auVar8 = vdpps_avx(auVar230,auVar248,0x7f);
                auVar9 = vdpps_avx(_local_880,auVar182,0x7f);
                auVar96 = vdpps_avx(local_960._0_16_,auVar248,0x7f);
                auVar95 = vfmadd213ss_fma(ZEXT416((uint)(auVar100._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_860._0_4_ / fVar170)),auVar95)
                ;
                auVar270 = ZEXT1664(auVar95);
                fVar170 = auVar8._0_4_ + auVar9._0_4_;
                auVar273 = ZEXT464((uint)fVar170);
                auVar106._0_4_ = auVar274._0_4_ * auVar274._0_4_;
                auVar106._4_4_ = auVar274._4_4_ * auVar274._4_4_;
                auVar106._8_4_ = auVar274._8_4_ * auVar274._8_4_;
                auVar106._12_4_ = auVar274._12_4_ * auVar274._12_4_;
                auVar100 = vdpps_avx(_local_880,auVar230,0x7f);
                auVar9 = vsubps_avx(auVar7,auVar106);
                auVar8 = vrsqrtss_avx(auVar9,auVar9);
                fVar206 = auVar9._0_4_;
                fVar205 = auVar8._0_4_;
                fVar205 = fVar205 * 1.5 + fVar206 * -0.5 * fVar205 * fVar205 * fVar205;
                auVar8 = vdpps_avx(_local_880,local_960._0_16_,0x7f);
                auVar100 = vfnmadd231ss_fma(auVar100,auVar274,ZEXT416((uint)fVar170));
                auVar8 = vfnmadd231ss_fma(auVar8,auVar274,auVar96);
                if (fVar206 < 0.0) {
                  local_a40._0_16_ = auVar274;
                  local_a60._0_4_ = auVar95._0_4_;
                  local_900._0_16_ = ZEXT416((uint)fVar170);
                  local_9c0._0_16_ = auVar96;
                  local_8a0._0_16_ = auVar100;
                  local_8c0._0_4_ = fVar205;
                  local_760._0_16_ = auVar8;
                  fVar170 = sqrtf(fVar206);
                  auVar273 = ZEXT1664(local_900._0_16_);
                  auVar270 = ZEXT464((uint)local_a60._0_4_);
                  auVar242 = ZEXT464((uint)local_9a0._0_4_);
                  fVar205 = (float)local_8c0._0_4_;
                  auVar8 = local_760._0_16_;
                  auVar274 = local_a40._0_16_;
                  auVar96 = local_9c0._0_16_;
                  auVar100 = local_8a0._0_16_;
                }
                else {
                  auVar9 = vsqrtss_avx(auVar9,auVar9);
                  fVar170 = auVar9._0_4_;
                }
                auVar267 = ZEXT1664(auVar274);
                auVar233 = ZEXT1664(local_980._0_16_);
                auVar9 = vpermilps_avx(local_720._0_16_,0xff);
                fVar170 = fVar170 - auVar9._0_4_;
                auVar9 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xff);
                auVar100 = vfmsub213ss_fma(auVar100,ZEXT416((uint)fVar205),auVar9);
                auVar183._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
                auVar183._8_4_ = auVar96._8_4_ ^ 0x80000000;
                auVar183._12_4_ = auVar96._12_4_ ^ 0x80000000;
                auVar196._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
                auVar196._8_4_ = auVar100._8_4_ ^ 0x80000000;
                auVar196._12_4_ = auVar100._12_4_ ^ 0x80000000;
                auVar95 = ZEXT416((uint)(auVar8._0_4_ * fVar205));
                auVar148 = auVar273._0_16_;
                auVar8 = vfmsub231ss_fma(ZEXT416((uint)(auVar96._0_4_ * auVar100._0_4_)),auVar148,
                                         auVar95);
                auVar100 = vinsertps_avx(auVar196,auVar95,0x1c);
                uVar85 = auVar8._0_4_;
                auVar197._4_4_ = uVar85;
                auVar197._0_4_ = uVar85;
                auVar197._8_4_ = uVar85;
                auVar197._12_4_ = uVar85;
                auVar100 = vdivps_avx(auVar100,auVar197);
                auVar8 = vinsertps_avx(auVar148,auVar183,0x10);
                auVar8 = vdivps_avx(auVar8,auVar197);
                fVar205 = auVar274._0_4_;
                auVar157._0_4_ = fVar205 * auVar100._0_4_ + fVar170 * auVar8._0_4_;
                auVar157._4_4_ = fVar205 * auVar100._4_4_ + fVar170 * auVar8._4_4_;
                auVar157._8_4_ = fVar205 * auVar100._8_4_ + fVar170 * auVar8._8_4_;
                auVar157._12_4_ = fVar205 * auVar100._12_4_ + fVar170 * auVar8._12_4_;
                auVar100 = vsubps_avx(auVar246,auVar157);
                auVar253 = ZEXT1664(auVar100);
                auVar246 = vandps_avx(auVar274,local_a10);
              } while (auVar270._0_4_ <= auVar246._0_4_);
              auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar242._0_4_ + auVar270._0_4_)),
                                       local_780._0_16_,ZEXT416(0x36000000));
              auVar246 = vandps_avx(ZEXT416((uint)fVar170),local_a10);
            } while (auVar8._0_4_ <= auVar246._0_4_);
            fVar170 = auVar100._0_4_ + (float)local_840._0_4_;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar170) &&
               (fVar205 = (ray->super_RayK<1>).tfar, fVar170 <= fVar205)) {
              auVar246 = vmovshdup_avx(auVar100);
              fVar206 = auVar246._0_4_;
              if ((0.0 <= fVar206) && (fVar206 <= 1.0)) {
                auVar246 = vrsqrtss_avx(auVar7,auVar7);
                fVar207 = auVar246._0_4_;
                pGVar4 = (context->scene->geometries).items[uVar79].ptr;
                if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar187 = fVar207 * 1.5 + fVar187 * -0.5 * fVar207 * fVar207 * fVar207;
                  auVar184._0_4_ = fVar187 * (float)local_880._0_4_;
                  auVar184._4_4_ = fVar187 * (float)local_880._4_4_;
                  auVar184._8_4_ = fVar187 * fStack_878;
                  auVar184._12_4_ = fVar187 * fStack_874;
                  auVar9 = vfmadd213ps_fma(auVar9,auVar184,local_980._0_16_);
                  auVar246 = vshufps_avx(auVar184,auVar184,0xc9);
                  auVar7 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xc9);
                  auVar185._0_4_ = auVar184._0_4_ * auVar7._0_4_;
                  auVar185._4_4_ = auVar184._4_4_ * auVar7._4_4_;
                  auVar185._8_4_ = auVar184._8_4_ * auVar7._8_4_;
                  auVar185._12_4_ = auVar184._12_4_ * auVar7._12_4_;
                  auVar8 = vfmsub231ps_fma(auVar185,local_980._0_16_,auVar246);
                  auVar246 = vshufps_avx(auVar8,auVar8,0xc9);
                  auVar7 = vshufps_avx(auVar9,auVar9,0xc9);
                  auVar8 = vshufps_avx(auVar8,auVar8,0xd2);
                  auVar107._0_4_ = auVar9._0_4_ * auVar8._0_4_;
                  auVar107._4_4_ = auVar9._4_4_ * auVar8._4_4_;
                  auVar107._8_4_ = auVar9._8_4_ * auVar8._8_4_;
                  auVar107._12_4_ = auVar9._12_4_ * auVar8._12_4_;
                  auVar7 = vfmsub231ps_fma(auVar107,auVar246,auVar7);
                  auVar246 = vshufps_avx(auVar7,auVar7,0xe9);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar170;
                    uVar91 = vmovlps_avx(auVar246);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar91;
                    (ray->Ng).field_0.field_0.z = auVar7._0_4_;
                    ray->u = fVar206;
                    ray->v = 0.0;
                    ray->primID = local_8e0._0_4_;
                    ray->geomID = uVar79;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_930 = vmovlps_avx(auVar246);
                    local_928 = auVar7._0_4_;
                    local_924 = fVar206;
                    local_920 = 0;
                    local_91c = local_8e0._0_4_;
                    local_918 = uVar79;
                    local_914 = context->user->instID[0];
                    local_910 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar170;
                    local_a64 = -1;
                    local_a98.valid = &local_a64;
                    local_a98.geometryUserPtr = pGVar4->userPtr;
                    local_a98.context = context->user;
                    local_a98.hit = (RTCHitN *)&local_930;
                    local_a98.N = 1;
                    local_a98.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0111224a:
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar233 = ZEXT1664(auVar233._0_16_);
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        auVar270 = ZEXT1664(auVar270._0_16_);
                        auVar273 = ZEXT1664(auVar273._0_16_);
                        (*p_Var5)(&local_a98);
                        if (*local_a98.valid == 0) goto LAB_011122da;
                      }
                      (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).components[0] =
                           *(float *)local_a98.hit;
                      (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_a98.hit + 4);
                      (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_a98.hit + 8);
                      *(float *)((long)local_a98.ray + 0x3c) = *(float *)(local_a98.hit + 0xc);
                      *(float *)((long)local_a98.ray + 0x40) = *(float *)(local_a98.hit + 0x10);
                      *(float *)((long)local_a98.ray + 0x44) = *(float *)(local_a98.hit + 0x14);
                      *(float *)((long)local_a98.ray + 0x48) = *(float *)(local_a98.hit + 0x18);
                      *(float *)((long)local_a98.ray + 0x4c) = *(float *)(local_a98.hit + 0x1c);
                      *(float *)((long)local_a98.ray + 0x50) = *(float *)(local_a98.hit + 0x20);
                    }
                    else {
                      auVar233 = ZEXT1664(local_980._0_16_);
                      auVar253 = ZEXT1664(auVar100);
                      auVar267 = ZEXT1664(auVar274);
                      auVar270 = ZEXT1664(auVar270._0_16_);
                      auVar273 = ZEXT1664(auVar148);
                      (*pGVar4->intersectionFilterN)(&local_a98);
                      if (*local_a98.valid != 0) goto LAB_0111224a;
LAB_011122da:
                      (ray->super_RayK<1>).tfar = fVar205;
                    }
                  }
                }
              }
            }
LAB_01112140:
            fVar170 = (ray->super_RayK<1>).tfar;
            auVar122._4_4_ = fVar170;
            auVar122._0_4_ = fVar170;
            auVar122._8_4_ = fVar170;
            auVar122._12_4_ = fVar170;
            auVar122._16_4_ = fVar170;
            auVar122._20_4_ = fVar170;
            auVar122._24_4_ = fVar170;
            auVar122._28_4_ = fVar170;
            fVar187 = (ray->super_RayK<1>).tfar;
            auVar109 = vcmpps_avx(_local_7c0,auVar122,2);
            auVar109 = vandps_avx(auVar109,local_680);
            fVar170 = (float)local_820._0_4_;
            fVar206 = (float)local_820._4_4_;
            fVar219 = fStack_818;
            fVar221 = fStack_814;
            fVar258 = fStack_810;
            fVar125 = fStack_80c;
            fVar129 = fStack_808;
            fVar132 = fStack_804;
          }
          auVar166._0_4_ = fVar170 + local_580._0_4_;
          auVar166._4_4_ = fVar206 + local_580._4_4_;
          auVar166._8_4_ = fVar219 + local_580._8_4_;
          auVar166._12_4_ = fVar221 + local_580._12_4_;
          auVar166._16_4_ = fVar258 + local_580._16_4_;
          auVar166._20_4_ = fVar125 + local_580._20_4_;
          auVar166._24_4_ = fVar129 + local_580._24_4_;
          auVar166._28_4_ = fVar132 + local_580._28_4_;
          auVar186._4_4_ = fVar187;
          auVar186._0_4_ = fVar187;
          auVar186._8_4_ = fVar187;
          auVar186._12_4_ = fVar187;
          auVar186._16_4_ = fVar187;
          auVar186._20_4_ = fVar187;
          auVar186._24_4_ = fVar187;
          auVar186._28_4_ = fVar187;
          auVar109 = vcmpps_avx(auVar166,auVar186,2);
          auVar217 = vpand_avx2(local_7a0,local_620);
          auVar109 = vandps_avx(auVar109,auVar217);
          auVar204._0_4_ = fVar170 + local_5c0._0_4_;
          auVar204._4_4_ = fVar206 + local_5c0._4_4_;
          auVar204._8_4_ = fVar219 + local_5c0._8_4_;
          auVar204._12_4_ = fVar221 + local_5c0._12_4_;
          auVar204._16_4_ = fVar258 + local_5c0._16_4_;
          auVar204._20_4_ = fVar125 + local_5c0._20_4_;
          auVar204._24_4_ = fVar129 + local_5c0._24_4_;
          auVar204._28_4_ = fVar132 + local_5c0._28_4_;
          auVar6 = vcmpps_avx(auVar204,auVar186,2);
          auVar217 = vandps_avx(_local_800,local_7e0);
          auVar217 = vandps_avx(auVar6,auVar217);
          auVar217 = vorps_avx(auVar109,auVar217);
          if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar217 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar217 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar217 >> 0x7f,0) != '\0') ||
                (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar217 >> 0xbf,0) != '\0') ||
              (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar217[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar81 * 0x60) = auVar217;
            auVar109 = vblendvps_avx(_local_5c0,local_580,auVar109);
            *(undefined1 (*) [32])(auStack_160 + uVar81 * 0x60) = auVar109;
            uVar12 = vmovlps_avx(local_5d0);
            (&uStack_140)[uVar81 * 0xc] = uVar12;
            aiStack_138[uVar81 * 0x18] = local_aec + 1;
            uVar81 = (ulong)((int)uVar81 + 1);
          }
          uVar85 = local_8e0._0_4_;
        }
      }
    }
    fVar205 = (ray->super_RayK<1>).tfar;
    fVar187 = (ray->super_RayK<1>).tfar;
    auVar161._4_4_ = fVar187;
    auVar161._0_4_ = fVar187;
    auVar161._8_4_ = fVar187;
    auVar161._12_4_ = fVar187;
    auVar161._16_4_ = fVar187;
    auVar161._20_4_ = fVar187;
    auVar161._24_4_ = fVar187;
    auVar161._28_4_ = fVar187;
    while( true ) {
      uVar78 = (uint)uVar81;
      if (uVar78 == 0) {
        auVar108._4_4_ = fVar205;
        auVar108._0_4_ = fVar205;
        auVar108._8_4_ = fVar205;
        auVar108._12_4_ = fVar205;
        auVar246 = vcmpps_avx(local_5e0,auVar108,2);
        uVar79 = vmovmskps_avx(auVar246);
        uVar86 = (ulong)((uint)uVar86 & uVar79);
        goto LAB_0110feda;
      }
      uVar81 = (ulong)(uVar78 - 1);
      lVar82 = uVar81 * 0x60;
      auVar109 = *(undefined1 (*) [32])(auStack_160 + lVar82);
      auVar142._0_4_ = fVar170 + auVar109._0_4_;
      auVar142._4_4_ = fVar206 + auVar109._4_4_;
      auVar142._8_4_ = fVar219 + auVar109._8_4_;
      auVar142._12_4_ = fVar221 + auVar109._12_4_;
      auVar142._16_4_ = fVar258 + auVar109._16_4_;
      auVar142._20_4_ = fVar125 + auVar109._20_4_;
      auVar142._24_4_ = fVar129 + auVar109._24_4_;
      auVar142._28_4_ = fVar132 + auVar109._28_4_;
      auVar6 = vcmpps_avx(auVar142,auVar161,2);
      auVar217 = vandps_avx(auVar6,*(undefined1 (*) [32])(auStack_180 + lVar82));
      local_580 = auVar217;
      auVar6 = *(undefined1 (*) [32])(auStack_180 + lVar82) & auVar6;
      if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar6 >> 0x7f,0) != '\0') ||
            (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar6 >> 0xbf,0) != '\0') ||
          (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar6[0x1f] < '\0')
      break;
      uVar81 = (ulong)(uVar78 - 1);
    }
    auVar117._8_4_ = 0x7f800000;
    auVar117._0_8_ = 0x7f8000007f800000;
    auVar117._12_4_ = 0x7f800000;
    auVar117._16_4_ = 0x7f800000;
    auVar117._20_4_ = 0x7f800000;
    auVar117._24_4_ = 0x7f800000;
    auVar117._28_4_ = 0x7f800000;
    auVar109 = vblendvps_avx(auVar117,auVar109,auVar217);
    auVar6 = vshufps_avx(auVar109,auVar109,0xb1);
    auVar6 = vminps_avx(auVar109,auVar6);
    auVar199 = vshufpd_avx(auVar6,auVar6,5);
    auVar6 = vminps_avx(auVar6,auVar199);
    auVar199 = vpermpd_avx2(auVar6,0x4e);
    auVar6 = vminps_avx(auVar6,auVar199);
    auVar109 = vcmpps_avx(auVar109,auVar6,0);
    auVar6 = auVar217 & auVar109;
    if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar6 >> 0x7f,0) != '\0') ||
          (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar6 >> 0xbf,0) != '\0') ||
        (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar6[0x1f] < '\0') {
      auVar217 = vandps_avx(auVar109,auVar217);
    }
    uVar83 = vmovmskps_avx(auVar217);
    iVar11 = 0;
    for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
      iVar11 = iVar11 + 1;
    }
    *(undefined4 *)(local_580 + (uint)(iVar11 << 2)) = 0;
    uVar12 = (&uStack_140)[uVar81 * 0xc];
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar12;
    local_aec = aiStack_138[uVar81 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar82) = local_580;
    uVar83 = uVar78 - 1;
    if ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_580 >> 0x7f,0) != '\0') ||
          (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_580 >> 0xbf,0) != '\0') ||
        (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_580[0x1f] < '\0') {
      uVar83 = uVar78;
    }
    uVar90 = (undefined4)uVar12;
    auVar143._4_4_ = uVar90;
    auVar143._0_4_ = uVar90;
    auVar143._8_4_ = uVar90;
    auVar143._12_4_ = uVar90;
    auVar143._16_4_ = uVar90;
    auVar143._20_4_ = uVar90;
    auVar143._24_4_ = uVar90;
    auVar143._28_4_ = uVar90;
    auVar246 = vmovshdup_avx(auVar98);
    auVar246 = vsubps_avx(auVar246,auVar98);
    auVar118._0_4_ = auVar246._0_4_;
    auVar118._4_4_ = auVar118._0_4_;
    auVar118._8_4_ = auVar118._0_4_;
    auVar118._12_4_ = auVar118._0_4_;
    auVar118._16_4_ = auVar118._0_4_;
    auVar118._20_4_ = auVar118._0_4_;
    auVar118._24_4_ = auVar118._0_4_;
    auVar118._28_4_ = auVar118._0_4_;
    auVar246 = vfmadd132ps_fma(auVar118,auVar143,_DAT_01f7b040);
    _local_5c0 = ZEXT1632(auVar246);
    local_5d0._8_8_ = 0;
    local_5d0._0_8_ = *(ulong *)(local_5c0 + (uint)(iVar11 << 2));
    uVar81 = (ulong)uVar83;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }